

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  __int_type_conflict _Var2;
  long lVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [12];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  byte bVar47;
  byte bVar48;
  byte bVar49;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  long lVar50;
  byte bVar51;
  ulong uVar52;
  byte bVar53;
  Geometry *pGVar54;
  long lVar55;
  uint uVar56;
  bool bVar57;
  undefined1 uVar58;
  undefined1 uVar59;
  ulong uVar60;
  uint uVar61;
  uint uVar128;
  uint uVar129;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  uint uVar131;
  uint uVar132;
  uint uVar133;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  uint uVar130;
  uint uVar134;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  vint4 bi_2;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar149;
  undefined4 uVar150;
  float fVar151;
  float fVar168;
  float fVar169;
  vint4 bi_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar164 [32];
  undefined1 auVar155 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 bi;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  vint4 ai;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  vint4 ai_1;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  vint4 ai_2;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined4 uVar232;
  undefined4 uVar233;
  undefined1 auVar231 [64];
  float fVar234;
  undefined4 uVar236;
  undefined4 uVar237;
  undefined1 auVar235 [64];
  undefined1 auVar238 [28];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined4 uVar242;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a14;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_8a0 [16];
  uint local_890;
  uint local_88c;
  float local_888;
  float local_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  ulong local_7f8;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  Primitive *local_5d0;
  ulong local_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  RTCHitN local_480 [16];
  undefined1 auStack_470 [16];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined1 local_420 [16];
  uint local_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  uint uStack_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar126 [32];
  
  uVar52 = (ulong)(byte)prim[1];
  lVar50 = uVar52 * 0x25;
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 4 + 6)));
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 5 + 6)));
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 6 + 6)));
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0xf + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0x11 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0x1a + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0x1b + 6)));
  auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar50 + 0x12)));
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar63 = vsubps_avx512vl(auVar74,*(undefined1 (*) [16])(prim + lVar50 + 6));
  auVar64 = vpmovsxbd_avx512vl(ZEXT416(*(uint *)(prim + uVar52 * 0x1c + 6)));
  fVar13 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar50 + 0x16)) *
           *(float *)(prim + lVar50 + 0x1a);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar52 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar74);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar52 * 0xb + 6);
  auVar135 = vpmovsxwd_avx(auVar78);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar52 * 9 + 6);
  auVar153 = vpmovsxwd_avx(auVar75);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar52 * 0xd + 6);
  auVar79 = vpmovsxwd_avx(auVar79);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar52 * 0x12 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar52 * 0x16 + 6);
  auVar80 = vpmovsxwd_avx(auVar80);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar52 * 0x14 + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar74 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar74 = vinsertps_avx512f(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar63 = vmulps_avx512vl(auVar62,auVar63);
  auVar62 = vmulps_avx512vl(auVar62,auVar74);
  auVar65 = vcvtdq2ps_avx512vl(auVar71);
  auVar66 = vcvtdq2ps_avx512vl(auVar66);
  auVar67 = vcvtdq2ps_avx512vl(auVar67);
  auVar68 = vcvtdq2ps_avx512vl(auVar68);
  auVar69 = vcvtdq2ps_avx512vl(auVar69);
  auVar74 = vcvtdq2ps_avx(auVar70);
  auVar78 = vcvtdq2ps_avx(auVar72);
  auVar75 = vcvtdq2ps_avx(auVar73);
  auVar70 = vcvtdq2ps_avx512vl(auVar64);
  auVar71 = vbroadcastss_avx512vl(auVar62);
  auVar72 = vshufps_avx512vl(auVar62,auVar62,0x55);
  auVar73 = vshufps_avx512vl(auVar62,auVar62,0xaa);
  auVar62 = vmulps_avx512vl(auVar73,auVar67);
  auVar152._0_4_ = auVar73._0_4_ * auVar74._0_4_;
  auVar152._4_4_ = auVar73._4_4_ * auVar74._4_4_;
  auVar152._8_4_ = auVar73._8_4_ * auVar74._8_4_;
  auVar152._12_4_ = auVar73._12_4_ * auVar74._12_4_;
  auVar64._0_4_ = auVar70._0_4_ * auVar73._0_4_;
  auVar64._4_4_ = auVar70._4_4_ * auVar73._4_4_;
  auVar64._8_4_ = auVar70._8_4_ * auVar73._8_4_;
  auVar64._12_4_ = auVar70._12_4_ * auVar73._12_4_;
  auVar73 = vfmadd231ps_avx512vl(auVar62,auVar72,auVar66);
  auVar62 = vfmadd231ps_avx512vl(auVar152,auVar72,auVar69);
  auVar72 = vfmadd231ps_avx512vl(auVar64,auVar75,auVar72);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar71,auVar65);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar71,auVar68);
  auVar71 = vfmadd231ps_fma(auVar72,auVar78,auVar71);
  auVar72 = vbroadcastss_avx512vl(auVar63);
  auVar64 = vshufps_avx512vl(auVar63,auVar63,0x55);
  auVar63 = vshufps_avx512vl(auVar63,auVar63,0xaa);
  auVar67 = vmulps_avx512vl(auVar63,auVar67);
  auVar74 = vmulps_avx512vl(auVar63,auVar74);
  auVar70 = vmulps_avx512vl(auVar63,auVar70);
  auVar66 = vfmadd231ps_avx512vl(auVar67,auVar64,auVar66);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar64,auVar69);
  auVar75 = vfmadd231ps_avx512vl(auVar70,auVar64,auVar75);
  auVar63 = vfmadd231ps_avx512vl(auVar66,auVar72,auVar65);
  auVar64 = vfmadd231ps_avx512vl(auVar74,auVar72,auVar68);
  auVar65 = vfmadd231ps_avx512vl(auVar75,auVar72,auVar78);
  auVar246._8_4_ = 0x7fffffff;
  auVar246._0_8_ = 0x7fffffff7fffffff;
  auVar246._12_4_ = 0x7fffffff;
  auVar74 = vandps_avx(auVar246,auVar73);
  auVar243._8_4_ = 0x219392ef;
  auVar243._0_8_ = 0x219392ef219392ef;
  auVar243._12_4_ = 0x219392ef;
  uVar60 = vcmpps_avx512vl(auVar74,auVar243,1);
  bVar57 = (bool)((byte)uVar60 & 1);
  auVar76._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar73._0_4_;
  bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar73._4_4_;
  bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar73._8_4_;
  bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar73._12_4_;
  auVar74 = vandps_avx(auVar246,auVar62);
  uVar60 = vcmpps_avx512vl(auVar74,auVar243,1);
  bVar57 = (bool)((byte)uVar60 & 1);
  auVar77._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar62._0_4_;
  bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar62._4_4_;
  bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar62._8_4_;
  bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar62._12_4_;
  auVar74 = vandps_avx(auVar246,auVar71);
  uVar60 = vcmpps_avx512vl(auVar74,auVar243,1);
  bVar57 = (bool)((byte)uVar60 & 1);
  auVar62._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._0_4_;
  bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._4_4_;
  bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._8_4_;
  bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._12_4_;
  auVar78 = vrcp14ps_avx512vl(auVar76);
  auVar244._8_4_ = 0x3f800000;
  auVar244._0_8_ = 0x3f8000003f800000;
  auVar244._12_4_ = 0x3f800000;
  auVar74 = vfnmadd213ps_fma(auVar76,auVar78,auVar244);
  auVar75 = vfmadd132ps_fma(auVar74,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar77);
  auVar74 = vfnmadd213ps_fma(auVar77,auVar78,auVar244);
  auVar70 = vfmadd132ps_fma(auVar74,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar62);
  auVar74 = vfnmadd213ps_fma(auVar62,auVar78,auVar244);
  auVar72 = vfmadd132ps_fma(auVar74,auVar78,auVar78);
  auVar203._4_4_ = fVar13;
  auVar203._0_4_ = fVar13;
  auVar203._8_4_ = fVar13;
  auVar203._12_4_ = fVar13;
  auVar74 = vcvtdq2ps_avx(auVar15);
  auVar78 = vcvtdq2ps_avx(auVar135);
  auVar78 = vsubps_avx(auVar78,auVar74);
  auVar73 = vfmadd213ps_fma(auVar78,auVar203,auVar74);
  auVar74 = vcvtdq2ps_avx(auVar153);
  auVar78 = vcvtdq2ps_avx(auVar79);
  auVar78 = vsubps_avx(auVar78,auVar74);
  auVar79 = vfmadd213ps_fma(auVar78,auVar203,auVar74);
  auVar74 = vcvtdq2ps_avx(auVar81);
  auVar78 = vcvtdq2ps_avx(auVar80);
  auVar78 = vsubps_avx(auVar78,auVar74);
  auVar81 = vfmadd213ps_fma(auVar78,auVar203,auVar74);
  auVar74 = vcvtdq2ps_avx(auVar82);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar52 * 0x18 + 6);
  auVar78 = vpmovsxwd_avx(auVar71);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar74);
  auVar80 = vfmadd213ps_fma(auVar78,auVar203,auVar74);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar52 * 0x1d + 6);
  auVar74 = vpmovsxwd_avx(auVar66);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar52 * 0x21 + 6);
  auVar78 = vpmovsxwd_avx(auVar67);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar74);
  auVar82 = vfmadd213ps_fma(auVar78,auVar203,auVar74);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar52 * 0x1f + 6);
  auVar74 = vpmovsxwd_avx(auVar68);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar52 * 0x23 + 6);
  auVar78 = vpmovsxwd_avx(auVar69);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar74);
  auVar78 = vfmadd213ps_fma(auVar78,auVar203,auVar74);
  auVar74 = vsubps_avx512vl(auVar73,auVar63);
  auVar204._0_4_ = auVar75._0_4_ * auVar74._0_4_;
  auVar204._4_4_ = auVar75._4_4_ * auVar74._4_4_;
  auVar204._8_4_ = auVar75._8_4_ * auVar74._8_4_;
  auVar204._12_4_ = auVar75._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx512vl(auVar79,auVar63);
  auVar63._0_4_ = auVar75._0_4_ * auVar74._0_4_;
  auVar63._4_4_ = auVar75._4_4_ * auVar74._4_4_;
  auVar63._8_4_ = auVar75._8_4_ * auVar74._8_4_;
  auVar63._12_4_ = auVar75._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar81,auVar64);
  auVar214._0_4_ = auVar70._0_4_ * auVar74._0_4_;
  auVar214._4_4_ = auVar70._4_4_ * auVar74._4_4_;
  auVar214._8_4_ = auVar70._8_4_ * auVar74._8_4_;
  auVar214._12_4_ = auVar70._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar80,auVar64);
  auVar153._0_4_ = auVar70._0_4_ * auVar74._0_4_;
  auVar153._4_4_ = auVar70._4_4_ * auVar74._4_4_;
  auVar153._8_4_ = auVar70._8_4_ * auVar74._8_4_;
  auVar153._12_4_ = auVar70._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar82,auVar65);
  auVar222._0_4_ = auVar72._0_4_ * auVar74._0_4_;
  auVar222._4_4_ = auVar72._4_4_ * auVar74._4_4_;
  auVar222._8_4_ = auVar72._8_4_ * auVar74._8_4_;
  auVar222._12_4_ = auVar72._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar78,auVar65);
  auVar135._0_4_ = auVar72._0_4_ * auVar74._0_4_;
  auVar135._4_4_ = auVar72._4_4_ * auVar74._4_4_;
  auVar135._8_4_ = auVar72._8_4_ * auVar74._8_4_;
  auVar135._12_4_ = auVar72._12_4_ * auVar74._12_4_;
  auVar74 = vpminsd_avx(auVar204,auVar63);
  auVar78 = vpminsd_avx(auVar214,auVar153);
  auVar74 = vmaxps_avx(auVar74,auVar78);
  auVar78 = vpminsd_avx(auVar222,auVar135);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar70._4_4_ = uVar150;
  auVar70._0_4_ = uVar150;
  auVar70._8_4_ = uVar150;
  auVar70._12_4_ = uVar150;
  auVar78 = vmaxps_avx512vl(auVar78,auVar70);
  auVar74 = vmaxps_avx(auVar74,auVar78);
  auVar72._8_4_ = 0x3f7ffffa;
  auVar72._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar72._12_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar74,auVar72);
  auVar74 = vpmaxsd_avx(auVar204,auVar63);
  auVar78 = vpmaxsd_avx(auVar214,auVar153);
  auVar74 = vminps_avx(auVar74,auVar78);
  auVar78 = vpmaxsd_avx(auVar222,auVar135);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar73._4_4_ = uVar150;
  auVar73._0_4_ = uVar150;
  auVar73._8_4_ = uVar150;
  auVar73._12_4_ = uVar150;
  auVar78 = vminps_avx512vl(auVar78,auVar73);
  auVar74 = vminps_avx(auVar74,auVar78);
  auVar15._8_4_ = 0x3f800003;
  auVar15._0_8_ = 0x3f8000033f800003;
  auVar15._12_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar15);
  auVar78 = vpbroadcastd_avx512vl();
  uVar16 = vcmpps_avx512vl(local_300,auVar74,2);
  uVar18 = vpcmpgtd_avx512vl(auVar78,_DAT_01f4ad30);
  local_5c8 = (ulong)((byte)uVar16 & 0xf & (byte)uVar18);
  local_4b0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar221 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  local_5d0 = prim;
LAB_01899ca8:
  if (local_5c8 == 0) {
LAB_0189c564:
    return local_5c8 != 0;
  }
  lVar50 = 0;
  for (uVar60 = local_5c8; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  local_7f8 = (ulong)*(uint *)(local_5d0 + 2);
  pGVar54 = (context->scene->geometries).items[local_7f8].ptr;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar54->field_0x58 +
                           (ulong)*(uint *)(local_5d0 + lVar50 * 4 + 6) *
                           pGVar54[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar13 = (pGVar54->time_range).lower;
  fVar13 = pGVar54->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar13) / ((pGVar54->time_range).upper - fVar13));
  auVar74 = vroundss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),9);
  auVar74 = vminss_avx(auVar74,ZEXT416((uint)(pGVar54->fnumTimeSegments + -1.0)));
  auVar74 = vmaxss_avx(ZEXT816(0) << 0x20,auVar74);
  fVar13 = fVar13 - auVar74._0_4_;
  _Var2 = pGVar54[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar55 = (long)(int)auVar74._0_4_ * 0x38;
  lVar50 = *(long *)(_Var2 + 0x10 + lVar55);
  lVar3 = *(long *)(_Var2 + 0x38 + lVar55);
  lVar4 = *(long *)(_Var2 + 0x48 + lVar55);
  pfVar1 = (float *)(lVar3 + uVar60 * lVar4);
  auVar136._0_4_ = fVar13 * *pfVar1;
  auVar136._4_4_ = fVar13 * pfVar1[1];
  auVar136._8_4_ = fVar13 * pfVar1[2];
  auVar136._12_4_ = fVar13 * pfVar1[3];
  pfVar1 = (float *)(lVar3 + (uVar60 + 1) * lVar4);
  auVar154._0_4_ = fVar13 * *pfVar1;
  auVar154._4_4_ = fVar13 * pfVar1[1];
  auVar154._8_4_ = fVar13 * pfVar1[2];
  auVar154._12_4_ = fVar13 * pfVar1[3];
  pfVar1 = (float *)(lVar3 + (uVar60 + 2) * lVar4);
  auVar175._0_4_ = fVar13 * *pfVar1;
  auVar175._4_4_ = fVar13 * pfVar1[1];
  auVar175._8_4_ = fVar13 * pfVar1[2];
  auVar175._12_4_ = fVar13 * pfVar1[3];
  pfVar1 = (float *)(lVar3 + lVar4 * (uVar60 + 3));
  auVar196._0_4_ = fVar13 * *pfVar1;
  auVar196._4_4_ = fVar13 * pfVar1[1];
  auVar196._8_4_ = fVar13 * pfVar1[2];
  auVar196._12_4_ = fVar13 * pfVar1[3];
  lVar3 = *(long *)(_Var2 + lVar55);
  fVar13 = 1.0 - fVar13;
  auVar205._4_4_ = fVar13;
  auVar205._0_4_ = fVar13;
  auVar205._8_4_ = fVar13;
  auVar205._12_4_ = fVar13;
  auVar75 = vfmadd231ps_fma(auVar136,auVar205,*(undefined1 (*) [16])(lVar3 + lVar50 * uVar60));
  auVar79 = vfmadd231ps_fma(auVar154,auVar205,*(undefined1 (*) [16])(lVar3 + lVar50 * (uVar60 + 1)))
  ;
  auVar81 = vfmadd231ps_fma(auVar175,auVar205,*(undefined1 (*) [16])(lVar3 + lVar50 * (uVar60 + 2)))
  ;
  auVar80 = vfmadd231ps_fma(auVar196,auVar205,*(undefined1 (*) [16])(lVar3 + lVar50 * (uVar60 + 3)))
  ;
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar78 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar74 = vunpcklps_avx512vl(local_3a0._0_16_,local_3c0._0_16_);
  local_3e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar66 = local_3e0._0_16_;
  local_6b0 = vinsertps_avx512f(auVar74,auVar66,0x28);
  auVar215._0_4_ = auVar75._0_4_ + auVar79._0_4_ + auVar81._0_4_ + auVar80._0_4_;
  auVar215._4_4_ = auVar75._4_4_ + auVar79._4_4_ + auVar81._4_4_ + auVar80._4_4_;
  auVar215._8_4_ = auVar75._8_4_ + auVar79._8_4_ + auVar81._8_4_ + auVar80._8_4_;
  auVar215._12_4_ = auVar75._12_4_ + auVar79._12_4_ + auVar81._12_4_ + auVar80._12_4_;
  auVar65._8_4_ = 0x3e800000;
  auVar65._0_8_ = 0x3e8000003e800000;
  auVar65._12_4_ = 0x3e800000;
  auVar74 = vmulps_avx512vl(auVar215,auVar65);
  auVar74 = vsubps_avx(auVar74,auVar78);
  auVar74 = vdpps_avx(auVar74,local_6b0,0x7f);
  local_490 = vpbroadcastd_avx512vl();
  local_6c0 = vdpps_avx(local_6b0,local_6b0,0x7f);
  fVar13 = *(float *)(ray + k * 4 + 0x30);
  auVar223._4_12_ = ZEXT812(0) << 0x20;
  auVar223._0_4_ = local_6c0._0_4_;
  auVar71 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar223);
  auVar82 = vfnmadd213ss_fma(auVar71,local_6c0,ZEXT416(0x40000000));
  local_260 = auVar74._0_4_ * auVar71._0_4_ * auVar82._0_4_;
  auVar224._4_4_ = local_260;
  auVar224._0_4_ = local_260;
  auVar224._8_4_ = local_260;
  auVar224._12_4_ = local_260;
  fStack_350 = local_260;
  _local_360 = auVar224;
  fStack_34c = local_260;
  fStack_348 = local_260;
  fStack_344 = local_260;
  auVar74 = vfmadd231ps_fma(auVar78,local_6b0,auVar224);
  auVar74 = vblendps_avx(auVar74,ZEXT816(0) << 0x40,8);
  auVar78 = vsubps_avx(auVar75,auVar74);
  auVar75 = vsubps_avx(auVar81,auVar74);
  auVar79 = vsubps_avx(auVar79,auVar74);
  auVar74 = vsubps_avx(auVar80,auVar74);
  local_720 = vbroadcastss_avx512vl(auVar78);
  auVar249 = ZEXT3264(local_720);
  auVar88._8_4_ = 1;
  auVar88._0_8_ = 0x100000001;
  auVar88._12_4_ = 1;
  auVar88._16_4_ = 1;
  auVar88._20_4_ = 1;
  auVar88._24_4_ = 1;
  auVar88._28_4_ = 1;
  local_560 = ZEXT1632(auVar78);
  local_740 = vpermps_avx512vl(auVar88,local_560);
  auVar250 = ZEXT3264(local_740);
  auVar89._8_4_ = 2;
  auVar89._0_8_ = 0x200000002;
  auVar89._12_4_ = 2;
  auVar89._16_4_ = 2;
  auVar89._20_4_ = 2;
  auVar89._24_4_ = 2;
  auVar89._28_4_ = 2;
  local_760 = vpermps_avx2(auVar89,local_560);
  auVar90._8_4_ = 3;
  auVar90._0_8_ = 0x300000003;
  auVar90._12_4_ = 3;
  auVar90._16_4_ = 3;
  auVar90._20_4_ = 3;
  auVar90._24_4_ = 3;
  auVar90._28_4_ = 3;
  local_780 = vpermps_avx2(auVar90,local_560);
  fVar234 = auVar79._0_4_;
  auVar245._4_4_ = fVar234;
  auVar245._0_4_ = fVar234;
  auVar245._8_4_ = fVar234;
  auVar245._12_4_ = fVar234;
  auVar245._16_4_ = fVar234;
  auVar245._20_4_ = fVar234;
  auVar245._24_4_ = fVar234;
  auVar245._28_4_ = fVar234;
  local_5a0 = ZEXT1632(auVar79);
  local_7a0 = vpermps_avx2(auVar88,local_5a0);
  auVar247 = ZEXT3264(local_7a0);
  local_7c0 = vpermps_avx512vl(auVar89,local_5a0);
  auVar83 = vpermps_avx512vl(auVar90,local_5a0);
  auVar251 = ZEXT3264(auVar83);
  auVar83 = vbroadcastss_avx512vl(auVar75);
  local_580 = ZEXT1632(auVar75);
  auVar84 = vpermps_avx512vl(auVar88,local_580);
  auVar85 = vpermps_avx512vl(auVar89,local_580);
  auVar86 = vpermps_avx512vl(auVar90,local_580);
  auVar87 = vbroadcastss_avx512vl(auVar74);
  _local_5c0 = ZEXT1632(auVar74);
  auVar88 = vpermps_avx512vl(auVar88,_local_5c0);
  auVar89 = vpermps_avx512vl(auVar89,_local_5c0);
  local_880 = vpermps_avx512vl(auVar90,_local_5c0);
  auVar248 = ZEXT3264(local_880);
  auVar74 = vmulss_avx512f(auVar66,auVar66);
  auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),local_3c0,local_3c0);
  auVar90 = vfmadd231ps_avx512vl(auVar90,local_3a0,local_3a0);
  local_220._0_4_ = auVar90._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  local_240 = vandps_avx(auVar221._0_32_,local_220);
  auVar231 = ZEXT3264(local_760);
  local_610 = ZEXT416((uint)local_260);
  local_260 = fVar13 - local_260;
  auVar241 = ZEXT3264(local_7a0);
  auVar235 = ZEXT3264(local_780);
  auVar228 = ZEXT3264(local_7c0);
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  uVar56 = 0;
  bVar49 = 0;
  local_a14 = 1;
  local_4a0 = vpbroadcastd_avx512vl();
  auVar74 = vsqrtss_avx(local_6c0,local_6c0);
  local_884 = auVar74._0_4_;
  auVar74 = vsqrtss_avx(local_6c0,local_6c0);
  local_888 = auVar74._0_4_;
  local_2f0 = ZEXT816(0x3f80000000000000);
  do {
    auVar74 = vmovshdup_avx(local_2f0);
    auVar74 = vsubps_avx(auVar74,local_2f0);
    fVar149 = auVar74._0_4_;
    fVar172 = fVar149 * 0.04761905;
    auVar201._0_4_ = local_2f0._0_4_;
    auVar201._4_4_ = auVar201._0_4_;
    auVar201._8_4_ = auVar201._0_4_;
    auVar201._12_4_ = auVar201._0_4_;
    auVar201._16_4_ = auVar201._0_4_;
    auVar201._20_4_ = auVar201._0_4_;
    auVar201._24_4_ = auVar201._0_4_;
    auVar201._28_4_ = auVar201._0_4_;
    auVar216._4_4_ = fVar149;
    auVar216._0_4_ = fVar149;
    auVar216._8_4_ = fVar149;
    auVar216._12_4_ = fVar149;
    local_860._16_4_ = fVar149;
    local_860._0_16_ = auVar216;
    local_860._20_4_ = fVar149;
    local_860._24_4_ = fVar149;
    local_860._28_4_ = fVar149;
    auVar74 = vfmadd231ps_fma(auVar201,local_860,_DAT_01f7b040);
    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar90 = vsubps_avx512vl(auVar91,ZEXT1632(auVar74));
    fVar149 = auVar74._0_4_;
    fVar168 = auVar74._4_4_;
    auVar106._4_4_ = fVar234 * fVar168;
    auVar106._0_4_ = fVar234 * fVar149;
    fVar169 = auVar74._8_4_;
    auVar106._8_4_ = fVar234 * fVar169;
    fVar170 = auVar74._12_4_;
    auVar106._12_4_ = fVar234 * fVar170;
    auVar106._16_4_ = fVar234 * 0.0;
    auVar106._20_4_ = fVar234 * 0.0;
    auVar106._24_4_ = fVar234 * 0.0;
    auVar106._28_4_ = DAT_01f7b040._28_4_;
    auVar94._4_4_ = auVar241._4_4_ * fVar168;
    auVar94._0_4_ = auVar241._0_4_ * fVar149;
    auVar94._8_4_ = auVar241._8_4_ * fVar169;
    auVar94._12_4_ = auVar241._12_4_ * fVar170;
    auVar94._16_4_ = auVar241._16_4_ * 0.0;
    auVar94._20_4_ = auVar241._20_4_ * 0.0;
    auVar94._24_4_ = auVar241._24_4_ * 0.0;
    auVar94._28_4_ = auVar201._0_4_;
    auVar107._4_4_ = auVar228._4_4_ * fVar168;
    auVar107._0_4_ = auVar228._0_4_ * fVar149;
    auVar107._8_4_ = auVar228._8_4_ * fVar169;
    auVar107._12_4_ = auVar228._12_4_ * fVar170;
    auVar107._16_4_ = auVar228._16_4_ * 0.0;
    auVar107._20_4_ = auVar228._20_4_ * 0.0;
    auVar107._24_4_ = auVar228._24_4_ * 0.0;
    auVar107._28_4_ = fVar234;
    local_840 = auVar251._0_32_;
    auVar92 = vmulps_avx512vl(local_840,ZEXT1632(auVar74));
    auVar93 = vfmadd231ps_avx512vl(auVar106,auVar90,auVar249._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar250._0_32_);
    auVar78 = vfmadd231ps_fma(auVar107,auVar90,auVar231._0_32_);
    auVar75 = vfmadd231ps_fma(auVar92,auVar90,auVar235._0_32_);
    auVar92 = vmulps_avx512vl(auVar83,ZEXT1632(auVar74));
    auVar101 = ZEXT1632(auVar74);
    auVar95 = vmulps_avx512vl(auVar84,auVar101);
    auVar96 = vmulps_avx512vl(auVar85,auVar101);
    auVar97 = vmulps_avx512vl(auVar86,auVar101);
    auVar79 = vfmadd231ps_fma(auVar92,auVar90,auVar245);
    auVar81 = vfmadd231ps_fma(auVar95,auVar90,auVar241._0_32_);
    auVar80 = vfmadd231ps_fma(auVar96,auVar90,auVar228._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar97,auVar90,local_840);
    auVar95 = vmulps_avx512vl(auVar87,auVar101);
    auVar96 = vmulps_avx512vl(auVar88,auVar101);
    auVar97 = vmulps_avx512vl(auVar89,auVar101);
    auVar98 = vmulps_avx512vl(auVar248._0_32_,auVar101);
    auVar99 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar83);
    auVar100 = vfmadd231ps_avx512vl(auVar96,auVar90,auVar84);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,auVar85);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar90,auVar86);
    auVar221._28_36_ = auVar247._28_36_;
    auVar221._0_28_ =
         ZEXT1628(CONCAT412(fVar170 * auVar79._12_4_,
                            CONCAT48(fVar169 * auVar79._8_4_,
                                     CONCAT44(fVar168 * auVar79._4_4_,fVar149 * auVar79._0_4_))));
    auVar95 = vmulps_avx512vl(auVar101,ZEXT1632(auVar81));
    auVar96 = vmulps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar80));
    auVar101 = vmulps_avx512vl(ZEXT1632(auVar74),auVar92);
    auVar74 = vfmadd231ps_fma(auVar221._0_32_,auVar90,auVar93);
    auVar102 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar94);
    auVar103 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar78));
    auVar104 = vfmadd231ps_avx512vl(auVar101,auVar90,ZEXT1632(auVar75));
    auVar109._0_4_ = auVar99._0_4_ * fVar149;
    auVar109._4_4_ = auVar99._4_4_ * fVar168;
    auVar109._8_4_ = auVar99._8_4_ * fVar169;
    auVar109._12_4_ = auVar99._12_4_ * fVar170;
    auVar109._16_4_ = auVar99._16_4_ * 0.0;
    auVar109._20_4_ = auVar99._20_4_ * 0.0;
    auVar109._24_4_ = auVar99._24_4_ * 0.0;
    auVar109._28_4_ = 0;
    auVar95._4_4_ = auVar100._4_4_ * fVar168;
    auVar95._0_4_ = auVar100._0_4_ * fVar149;
    auVar95._8_4_ = auVar100._8_4_ * fVar169;
    auVar95._12_4_ = auVar100._12_4_ * fVar170;
    auVar95._16_4_ = auVar100._16_4_ * 0.0;
    auVar95._20_4_ = auVar100._20_4_ * 0.0;
    auVar95._24_4_ = auVar100._24_4_ * 0.0;
    auVar95._28_4_ = auVar99._28_4_;
    auVar96._4_4_ = auVar97._4_4_ * fVar168;
    auVar96._0_4_ = auVar97._0_4_ * fVar149;
    auVar96._8_4_ = auVar97._8_4_ * fVar169;
    auVar96._12_4_ = auVar97._12_4_ * fVar170;
    auVar96._16_4_ = auVar97._16_4_ * 0.0;
    auVar96._20_4_ = auVar97._20_4_ * 0.0;
    auVar96._24_4_ = auVar97._24_4_ * 0.0;
    auVar96._28_4_ = auVar100._28_4_;
    auVar100._4_4_ = auVar98._4_4_ * fVar168;
    auVar100._0_4_ = auVar98._0_4_ * fVar149;
    auVar100._8_4_ = auVar98._8_4_ * fVar169;
    auVar100._12_4_ = auVar98._12_4_ * fVar170;
    auVar100._16_4_ = auVar98._16_4_ * 0.0;
    auVar100._20_4_ = auVar98._20_4_ * 0.0;
    auVar100._24_4_ = auVar98._24_4_ * 0.0;
    auVar100._28_4_ = auVar97._28_4_;
    auVar78 = vfmadd231ps_fma(auVar109,auVar90,ZEXT1632(auVar79));
    auVar75 = vfmadd231ps_fma(auVar95,auVar90,ZEXT1632(auVar81));
    auVar79 = vfmadd231ps_fma(auVar96,auVar90,ZEXT1632(auVar80));
    auVar81 = vfmadd231ps_fma(auVar100,auVar90,auVar92);
    auVar101._28_4_ = auVar94._28_4_;
    auVar101._0_28_ =
         ZEXT1628(CONCAT412(auVar75._12_4_ * fVar170,
                            CONCAT48(auVar75._8_4_ * fVar169,
                                     CONCAT44(auVar75._4_4_ * fVar168,auVar75._0_4_ * fVar149))));
    auVar105._28_4_ = auVar93._28_4_;
    auVar105._0_28_ =
         ZEXT1628(CONCAT412(auVar79._12_4_ * fVar170,
                            CONCAT48(auVar79._8_4_ * fVar169,
                                     CONCAT44(auVar79._4_4_ * fVar168,auVar79._0_4_ * fVar149))));
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar170 * auVar78._12_4_,
                                                 CONCAT48(fVar169 * auVar78._8_4_,
                                                          CONCAT44(fVar168 * auVar78._4_4_,
                                                                   fVar149 * auVar78._0_4_)))),
                              auVar90,ZEXT1632(auVar74));
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar90,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar105,auVar90,auVar103);
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar170,
                                            CONCAT48(auVar81._8_4_ * fVar169,
                                                     CONCAT44(auVar81._4_4_ * fVar168,
                                                              auVar81._0_4_ * fVar149)))),auVar104,
                         auVar90);
    auVar90 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar74));
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar75),auVar102);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar79),auVar103);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar81),auVar104);
    auVar117._0_4_ = fVar172 * auVar90._0_4_ * 3.0;
    auVar117._4_4_ = fVar172 * auVar90._4_4_ * 3.0;
    auVar117._8_4_ = fVar172 * auVar90._8_4_ * 3.0;
    auVar117._12_4_ = fVar172 * auVar90._12_4_ * 3.0;
    auVar117._16_4_ = fVar172 * auVar90._16_4_ * 3.0;
    auVar117._20_4_ = fVar172 * auVar90._20_4_ * 3.0;
    auVar117._24_4_ = fVar172 * auVar90._24_4_ * 3.0;
    auVar117._28_4_ = 0;
    auVar118._0_4_ = fVar172 * auVar94._0_4_ * 3.0;
    auVar118._4_4_ = fVar172 * auVar94._4_4_ * 3.0;
    auVar118._8_4_ = fVar172 * auVar94._8_4_ * 3.0;
    auVar118._12_4_ = fVar172 * auVar94._12_4_ * 3.0;
    auVar118._16_4_ = fVar172 * auVar94._16_4_ * 3.0;
    auVar118._20_4_ = fVar172 * auVar94._20_4_ * 3.0;
    auVar118._24_4_ = fVar172 * auVar94._24_4_ * 3.0;
    auVar118._28_4_ = 0;
    auVar102._4_4_ = fVar172 * auVar95._4_4_ * 3.0;
    auVar102._0_4_ = fVar172 * auVar95._0_4_ * 3.0;
    auVar102._8_4_ = fVar172 * auVar95._8_4_ * 3.0;
    auVar102._12_4_ = fVar172 * auVar95._12_4_ * 3.0;
    auVar102._16_4_ = fVar172 * auVar95._16_4_ * 3.0;
    auVar102._20_4_ = fVar172 * auVar95._20_4_ * 3.0;
    auVar102._24_4_ = fVar172 * auVar95._24_4_ * 3.0;
    auVar102._28_4_ = auVar98._28_4_;
    fVar149 = auVar96._0_4_ * 3.0 * fVar172;
    fVar168 = auVar96._4_4_ * 3.0 * fVar172;
    auVar103._4_4_ = fVar168;
    auVar103._0_4_ = fVar149;
    fVar169 = auVar96._8_4_ * 3.0 * fVar172;
    auVar103._8_4_ = fVar169;
    fVar170 = auVar96._12_4_ * 3.0 * fVar172;
    auVar103._12_4_ = fVar170;
    fVar171 = auVar96._16_4_ * 3.0 * fVar172;
    auVar103._16_4_ = fVar171;
    fVar173 = auVar96._20_4_ * 3.0 * fVar172;
    auVar103._20_4_ = fVar173;
    fVar174 = auVar96._24_4_ * 3.0 * fVar172;
    auVar103._24_4_ = fVar174;
    auVar103._28_4_ = fVar172;
    auVar74 = vxorps_avx512vl(auVar248._0_16_,auVar248._0_16_);
    auVar105 = vpermt2ps_avx512vl(ZEXT1632(auVar80),_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar106 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar94 = ZEXT1632(auVar74);
    auVar107 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,auVar94);
    auVar108._0_4_ = auVar92._0_4_ + fVar149;
    auVar108._4_4_ = auVar92._4_4_ + fVar168;
    auVar108._8_4_ = auVar92._8_4_ + fVar169;
    auVar108._12_4_ = auVar92._12_4_ + fVar170;
    auVar108._16_4_ = auVar92._16_4_ + fVar171;
    auVar108._20_4_ = auVar92._20_4_ + fVar173;
    auVar108._24_4_ = auVar92._24_4_ + fVar174;
    auVar108._28_4_ = auVar92._28_4_ + fVar172;
    auVar90 = vmaxps_avx(auVar92,auVar108);
    auVar93 = vminps_avx512vl(auVar92,auVar108);
    auVar97 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,auVar94);
    auVar108 = vpermt2ps_avx512vl(auVar117,_DAT_01fb9fc0,auVar94);
    auVar109 = vpermt2ps_avx512vl(auVar118,_DAT_01fb9fc0,auVar94);
    auVar115 = ZEXT1632(auVar74);
    auVar110 = vpermt2ps_avx512vl(auVar102,_DAT_01fb9fc0,auVar115);
    auVar92 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar115);
    auVar92 = vsubps_avx(auVar97,auVar92);
    auVar94 = vsubps_avx(auVar105,ZEXT1632(auVar80));
    auVar95 = vsubps_avx(auVar106,auVar100);
    auVar96 = vsubps_avx(auVar107,auVar101);
    auVar98 = vmulps_avx512vl(auVar95,auVar102);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar118,auVar96);
    auVar99 = vmulps_avx512vl(auVar96,auVar117);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar102,auVar94);
    auVar103 = vmulps_avx512vl(auVar94,auVar118);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar117,auVar95);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar99 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar99);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
    auVar99 = vmulps_avx512vl(auVar96,auVar96);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,auVar95);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar94);
    auVar103 = vrcp14ps_avx512vl(auVar99);
    auVar104 = vfnmadd213ps_avx512vl(auVar103,auVar99,auVar91);
    auVar103 = vfmadd132ps_avx512vl(auVar104,auVar103,auVar103);
    auVar98 = vmulps_avx512vl(auVar98,auVar103);
    auVar104 = vmulps_avx512vl(auVar95,auVar110);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar109,auVar96);
    auVar111 = vmulps_avx512vl(auVar96,auVar108);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar110,auVar94);
    auVar112 = vmulps_avx512vl(auVar94,auVar109);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar108,auVar95);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar104 = vfmadd231ps_avx512vl(auVar111,auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar104,auVar103);
    auVar98 = vmaxps_avx512vl(auVar98,auVar103);
    auVar98 = vsqrtps_avx512vl(auVar98);
    auVar103 = vmaxps_avx512vl(auVar92,auVar97);
    auVar90 = vmaxps_avx512vl(auVar90,auVar103);
    auVar103 = vaddps_avx512vl(auVar98,auVar90);
    auVar90 = vminps_avx(auVar92,auVar97);
    auVar90 = vminps_avx512vl(auVar93,auVar90);
    auVar90 = vsubps_avx512vl(auVar90,auVar98);
    auVar92._8_4_ = 0x3f800002;
    auVar92._0_8_ = 0x3f8000023f800002;
    auVar92._12_4_ = 0x3f800002;
    auVar92._16_4_ = 0x3f800002;
    auVar92._20_4_ = 0x3f800002;
    auVar92._24_4_ = 0x3f800002;
    auVar92._28_4_ = 0x3f800002;
    auVar92 = vmulps_avx512vl(auVar103,auVar92);
    auVar93._8_4_ = 0x3f7ffffc;
    auVar93._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar93._12_4_ = 0x3f7ffffc;
    auVar93._16_4_ = 0x3f7ffffc;
    auVar93._20_4_ = 0x3f7ffffc;
    auVar93._24_4_ = 0x3f7ffffc;
    auVar93._28_4_ = 0x3f7ffffc;
    local_700 = vmulps_avx512vl(auVar90,auVar93);
    auVar90 = vmulps_avx512vl(auVar92,auVar92);
    auVar92 = vrsqrt14ps_avx512vl(auVar99);
    auVar97._8_4_ = 0xbf000000;
    auVar97._0_8_ = 0xbf000000bf000000;
    auVar97._12_4_ = 0xbf000000;
    auVar97._16_4_ = 0xbf000000;
    auVar97._20_4_ = 0xbf000000;
    auVar97._24_4_ = 0xbf000000;
    auVar97._28_4_ = 0xbf000000;
    auVar93 = vmulps_avx512vl(auVar99,auVar97);
    fVar149 = auVar92._0_4_;
    fVar168 = auVar92._4_4_;
    fVar169 = auVar92._8_4_;
    fVar170 = auVar92._12_4_;
    fVar172 = auVar92._16_4_;
    fVar171 = auVar92._20_4_;
    fVar173 = auVar92._24_4_;
    auVar104._4_4_ = fVar168 * fVar168 * fVar168 * auVar93._4_4_;
    auVar104._0_4_ = fVar149 * fVar149 * fVar149 * auVar93._0_4_;
    auVar104._8_4_ = fVar169 * fVar169 * fVar169 * auVar93._8_4_;
    auVar104._12_4_ = fVar170 * fVar170 * fVar170 * auVar93._12_4_;
    auVar104._16_4_ = fVar172 * fVar172 * fVar172 * auVar93._16_4_;
    auVar104._20_4_ = fVar171 * fVar171 * fVar171 * auVar93._20_4_;
    auVar104._24_4_ = fVar173 * fVar173 * fVar173 * auVar93._24_4_;
    auVar104._28_4_ = auVar103._28_4_;
    auVar98._8_4_ = 0x3fc00000;
    auVar98._0_8_ = 0x3fc000003fc00000;
    auVar98._12_4_ = 0x3fc00000;
    auVar98._16_4_ = 0x3fc00000;
    auVar98._20_4_ = 0x3fc00000;
    auVar98._24_4_ = 0x3fc00000;
    auVar98._28_4_ = 0x3fc00000;
    auVar92 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar98);
    auVar247 = ZEXT3264(auVar92);
    auVar93 = vmulps_avx512vl(auVar94,auVar92);
    auVar97 = vmulps_avx512vl(auVar95,auVar92);
    auVar98 = vmulps_avx512vl(auVar96,auVar92);
    auVar212 = ZEXT1632(auVar80);
    auVar103 = vsubps_avx512vl(auVar115,auVar212);
    auVar104 = vsubps_avx512vl(auVar115,auVar100);
    auVar111 = vsubps_avx512vl(auVar115,auVar101);
    auVar99 = vmulps_avx512vl(local_3e0,auVar111);
    auVar99 = vfmadd231ps_avx512vl(auVar99,local_3c0,auVar104);
    auVar99 = vfmadd231ps_avx512vl(auVar99,local_3a0,auVar103);
    auVar112 = vmulps_avx512vl(auVar111,auVar111);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar104,auVar104);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,auVar103);
    auVar113 = vmulps_avx512vl(local_3e0,auVar98);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar97,local_3c0);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar93,local_3a0);
    auVar98 = vmulps_avx512vl(auVar111,auVar98);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar104,auVar97);
    auVar93 = vfmadd231ps_avx512vl(auVar97,auVar103,auVar93);
    auVar97 = vmulps_avx512vl(auVar113,auVar113);
    auVar98 = vsubps_avx512vl(local_220,auVar97);
    auVar114 = vmulps_avx512vl(auVar113,auVar93);
    auVar99 = vsubps_avx512vl(auVar99,auVar114);
    auVar114 = vaddps_avx512vl(auVar99,auVar99);
    auVar99 = vmulps_avx512vl(auVar93,auVar93);
    local_820 = vsubps_avx512vl(auVar112,auVar99);
    auVar90 = vsubps_avx512vl(local_820,auVar90);
    local_6e0 = vmulps_avx512vl(auVar114,auVar114);
    auVar99._8_4_ = 0x40800000;
    auVar99._0_8_ = 0x4080000040800000;
    auVar99._12_4_ = 0x40800000;
    auVar99._16_4_ = 0x40800000;
    auVar99._20_4_ = 0x40800000;
    auVar99._24_4_ = 0x40800000;
    auVar99._28_4_ = 0x40800000;
    _local_4e0 = vmulps_avx512vl(auVar98,auVar99);
    auVar99 = vmulps_avx512vl(_local_4e0,auVar90);
    auVar99 = vsubps_avx512vl(local_6e0,auVar99);
    uVar60 = vcmpps_avx512vl(auVar99,auVar115,5);
    bVar47 = (byte)uVar60;
    if (bVar47 == 0) {
LAB_0189aa0f:
      auVar250 = ZEXT3264(local_740);
      auVar249 = ZEXT3264(local_720);
      auVar241 = ZEXT3264(local_7a0);
      auVar235 = ZEXT3264(local_780);
      auVar231 = ZEXT3264(local_760);
      auVar228 = ZEXT3264(local_7c0);
      auVar221 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar248 = ZEXT3264(local_880);
    }
    else {
      auVar99 = vsqrtps_avx512vl(auVar99);
      local_640 = vaddps_avx512vl(auVar98,auVar98);
      local_660 = vrcp14ps_avx512vl(local_640);
      auVar91 = vfnmadd213ps_avx512vl(local_660,local_640,auVar91);
      auVar112 = vfmadd132ps_avx512vl(auVar91,local_660,local_660);
      auVar91._8_4_ = 0x80000000;
      auVar91._0_8_ = 0x8000000080000000;
      auVar91._12_4_ = 0x80000000;
      auVar91._16_4_ = 0x80000000;
      auVar91._20_4_ = 0x80000000;
      auVar91._24_4_ = 0x80000000;
      auVar91._28_4_ = 0x80000000;
      local_520 = vxorps_avx512vl(auVar114,auVar91);
      auVar91 = vsubps_avx512vl(local_520,auVar99);
      local_500 = vmulps_avx512vl(auVar91,auVar112);
      auVar99 = vsubps_avx512vl(auVar99,auVar114);
      local_540 = vmulps_avx512vl(auVar99,auVar112);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar91 = vblendmps_avx512vl(auVar99,local_500);
      auVar115._0_4_ =
           (uint)(bVar47 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar47 & 1) * auVar99._0_4_;
      bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar57 * auVar91._4_4_ | (uint)!bVar57 * auVar99._4_4_;
      bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar57 * auVar91._8_4_ | (uint)!bVar57 * auVar99._8_4_;
      bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar57 * auVar91._12_4_ | (uint)!bVar57 * auVar99._12_4_;
      bVar57 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar57 * auVar91._16_4_ | (uint)!bVar57 * auVar99._16_4_;
      bVar57 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar57 * auVar91._20_4_ | (uint)!bVar57 * auVar99._20_4_;
      bVar57 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar57 * auVar91._24_4_ | (uint)!bVar57 * auVar99._24_4_;
      bVar57 = SUB81(uVar60 >> 7,0);
      auVar115._28_4_ = (uint)bVar57 * auVar91._28_4_ | (uint)!bVar57 * auVar99._28_4_;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar91 = vblendmps_avx512vl(auVar99,local_540);
      auVar116._0_4_ =
           (uint)(bVar47 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar47 & 1) * auVar99._0_4_;
      bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar57 * auVar91._4_4_ | (uint)!bVar57 * auVar99._4_4_;
      bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar57 * auVar91._8_4_ | (uint)!bVar57 * auVar99._8_4_;
      bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar57 * auVar91._12_4_ | (uint)!bVar57 * auVar99._12_4_;
      bVar57 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar57 * auVar91._16_4_ | (uint)!bVar57 * auVar99._16_4_;
      bVar57 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar57 * auVar91._20_4_ | (uint)!bVar57 * auVar99._20_4_;
      bVar57 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar57 * auVar91._24_4_ | (uint)!bVar57 * auVar99._24_4_;
      bVar57 = SUB81(uVar60 >> 7,0);
      auVar116._28_4_ = (uint)bVar57 * auVar91._28_4_ | (uint)!bVar57 * auVar99._28_4_;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar97,auVar99);
      local_680 = vmaxps_avx512vl(local_240,auVar99);
      auVar112._8_4_ = 0x36000000;
      auVar112._0_8_ = 0x3600000036000000;
      auVar112._12_4_ = 0x36000000;
      auVar112._16_4_ = 0x36000000;
      auVar112._20_4_ = 0x36000000;
      auVar112._24_4_ = 0x36000000;
      auVar112._28_4_ = 0x36000000;
      local_6a0 = vmulps_avx512vl(local_680,auVar112);
      vandps_avx512vl(auVar98,auVar99);
      uVar52 = vcmpps_avx512vl(local_6a0,local_6a0,1);
      uVar60 = uVar60 & uVar52;
      bVar53 = (byte)uVar60;
      if (bVar53 != 0) {
        uVar52 = vcmpps_avx512vl(auVar90,_DAT_01f7b000,2);
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar98 = vblendmps_avx512vl(auVar90,auVar97);
        bVar51 = (byte)uVar52;
        uVar61 = (uint)(bVar51 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar51 & 1) * local_6a0._0_4_;
        bVar57 = (bool)((byte)(uVar52 >> 1) & 1);
        uVar128 = (uint)bVar57 * auVar98._4_4_ | (uint)!bVar57 * local_6a0._4_4_;
        bVar57 = (bool)((byte)(uVar52 >> 2) & 1);
        uVar129 = (uint)bVar57 * auVar98._8_4_ | (uint)!bVar57 * local_6a0._8_4_;
        bVar57 = (bool)((byte)(uVar52 >> 3) & 1);
        uVar130 = (uint)bVar57 * auVar98._12_4_ | (uint)!bVar57 * local_6a0._12_4_;
        bVar57 = (bool)((byte)(uVar52 >> 4) & 1);
        uVar131 = (uint)bVar57 * auVar98._16_4_ | (uint)!bVar57 * local_6a0._16_4_;
        bVar57 = (bool)((byte)(uVar52 >> 5) & 1);
        uVar132 = (uint)bVar57 * auVar98._20_4_ | (uint)!bVar57 * local_6a0._20_4_;
        bVar57 = (bool)((byte)(uVar52 >> 6) & 1);
        uVar133 = (uint)bVar57 * auVar98._24_4_ | (uint)!bVar57 * local_6a0._24_4_;
        bVar57 = SUB81(uVar52 >> 7,0);
        uVar134 = (uint)bVar57 * auVar98._28_4_ | (uint)!bVar57 * local_6a0._28_4_;
        auVar115._0_4_ = (bVar53 & 1) * uVar61 | !(bool)(bVar53 & 1) * auVar115._0_4_;
        bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar115._4_4_ = bVar57 * uVar128 | !bVar57 * auVar115._4_4_;
        bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar115._8_4_ = bVar57 * uVar129 | !bVar57 * auVar115._8_4_;
        bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar115._12_4_ = bVar57 * uVar130 | !bVar57 * auVar115._12_4_;
        bVar57 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar115._16_4_ = bVar57 * uVar131 | !bVar57 * auVar115._16_4_;
        bVar57 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar115._20_4_ = bVar57 * uVar132 | !bVar57 * auVar115._20_4_;
        bVar57 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar115._24_4_ = bVar57 * uVar133 | !bVar57 * auVar115._24_4_;
        bVar57 = SUB81(uVar60 >> 7,0);
        auVar115._28_4_ = bVar57 * uVar134 | !bVar57 * auVar115._28_4_;
        auVar90 = vblendmps_avx512vl(auVar97,auVar90);
        bVar57 = (bool)((byte)(uVar52 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar52 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar52 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar52 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar52 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar52 >> 6) & 1);
        bVar12 = SUB81(uVar52 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar53 & 1) *
             ((uint)(bVar51 & 1) * auVar90._0_4_ | !(bool)(bVar51 & 1) * uVar61) |
             !(bool)(bVar53 & 1) * auVar116._0_4_;
        bVar6 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar6 * ((uint)bVar57 * auVar90._4_4_ | !bVar57 * uVar128) |
             !bVar6 * auVar116._4_4_;
        bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar57 * ((uint)bVar7 * auVar90._8_4_ | !bVar7 * uVar129) |
             !bVar57 * auVar116._8_4_;
        bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar57 * ((uint)bVar8 * auVar90._12_4_ | !bVar8 * uVar130) |
             !bVar57 * auVar116._12_4_;
        bVar57 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar57 * ((uint)bVar9 * auVar90._16_4_ | !bVar9 * uVar131) |
             !bVar57 * auVar116._16_4_;
        bVar57 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar57 * ((uint)bVar10 * auVar90._20_4_ | !bVar10 * uVar132) |
             !bVar57 * auVar116._20_4_;
        bVar57 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar57 * ((uint)bVar11 * auVar90._24_4_ | !bVar11 * uVar133) |
             !bVar57 * auVar116._24_4_;
        bVar57 = SUB81(uVar60 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar57 * ((uint)bVar12 * auVar90._28_4_ | !bVar12 * uVar134) |
             !bVar57 * auVar116._28_4_;
        bVar47 = (~bVar53 | bVar51) & bVar47;
      }
      if ((bVar47 & 0x7f) == 0) goto LAB_0189aa0f;
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar97 = vxorps_avx512vl(auVar110,auVar90);
      auVar98 = vxorps_avx512vl(auVar108,auVar90);
      auVar221 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
      auVar99 = vxorps_avx512vl(auVar109,auVar90);
      auVar74 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),ZEXT416((uint)local_610._0_4_)
                              );
      auVar91 = vbroadcastss_avx512vl(auVar74);
      auVar91 = vminps_avx512vl(auVar91,auVar116);
      auVar46._4_4_ = fStack_25c;
      auVar46._0_4_ = local_260;
      auVar46._8_4_ = fStack_258;
      auVar46._12_4_ = fStack_254;
      auVar46._16_4_ = fStack_250;
      auVar46._20_4_ = fStack_24c;
      auVar46._24_4_ = fStack_248;
      auVar46._28_4_ = fStack_244;
      auVar108 = vmaxps_avx512vl(auVar46,auVar115);
      auVar109 = vmulps_avx512vl(auVar111,auVar102);
      auVar104 = vfmadd213ps_avx512vl(auVar104,auVar118,auVar109);
      auVar74 = vfmadd213ps_fma(auVar103,auVar117,auVar104);
      auVar102 = vmulps_avx512vl(local_3e0,auVar102);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_3c0,auVar118);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_3a0,auVar117);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar102,auVar103);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar103,auVar104,1);
      auVar109 = vxorps_avx512vl(ZEXT1632(auVar74),auVar90);
      auVar111 = vrcp14ps_avx512vl(auVar102);
      auVar112 = vxorps_avx512vl(auVar102,auVar90);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar110 = vfnmadd213ps_avx512vl(auVar111,auVar102,auVar117);
      auVar74 = vfmadd132ps_fma(auVar110,auVar111,auVar111);
      fVar149 = auVar74._0_4_ * auVar109._0_4_;
      fVar168 = auVar74._4_4_ * auVar109._4_4_;
      auVar110._4_4_ = fVar168;
      auVar110._0_4_ = fVar149;
      fVar169 = auVar74._8_4_ * auVar109._8_4_;
      auVar110._8_4_ = fVar169;
      fVar170 = auVar74._12_4_ * auVar109._12_4_;
      auVar110._12_4_ = fVar170;
      fVar172 = auVar109._16_4_ * 0.0;
      auVar110._16_4_ = fVar172;
      fVar171 = auVar109._20_4_ * 0.0;
      auVar110._20_4_ = fVar171;
      fVar173 = auVar109._24_4_ * 0.0;
      auVar110._24_4_ = fVar173;
      auVar110._28_4_ = auVar109._28_4_;
      uVar18 = vcmpps_avx512vl(auVar102,auVar112,1);
      bVar53 = (byte)uVar16 | (byte)uVar18;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar110 = vblendmps_avx512vl(auVar110,auVar118);
      auVar119._0_4_ =
           (uint)(bVar53 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar111._0_4_;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar57 * auVar110._4_4_ | (uint)!bVar57 * auVar111._4_4_;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar57 * auVar110._8_4_ | (uint)!bVar57 * auVar111._8_4_;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar57 * auVar110._12_4_ | (uint)!bVar57 * auVar111._12_4_;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar57 * auVar110._16_4_ | (uint)!bVar57 * auVar111._16_4_;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar57 * auVar110._20_4_ | (uint)!bVar57 * auVar111._20_4_;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar57 * auVar110._24_4_ | (uint)!bVar57 * auVar111._24_4_;
      auVar119._28_4_ =
           (uint)(bVar53 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar111._28_4_;
      auVar110 = vmaxps_avx512vl(auVar108,auVar119);
      uVar18 = vcmpps_avx512vl(auVar102,auVar112,6);
      bVar53 = (byte)uVar16 | (byte)uVar18;
      auVar120._0_4_ = (uint)(bVar53 & 1) * 0x7f800000 | (uint)!(bool)(bVar53 & 1) * (int)fVar149;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar168;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar169;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar170;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar172;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar171;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar173;
      auVar120._28_4_ =
           (uint)(bVar53 >> 7) * 0x7f800000 | (uint)!(bool)(bVar53 >> 7) * auVar109._28_4_;
      auVar102 = vminps_avx512vl(auVar91,auVar120);
      auVar74 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar74),auVar105);
      auVar106 = vsubps_avx512vl(ZEXT1632(auVar74),auVar106);
      auVar91 = ZEXT1632(auVar74);
      auVar107 = vsubps_avx512vl(auVar91,auVar107);
      auVar107 = vmulps_avx512vl(auVar107,auVar97);
      auVar106 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar106);
      auVar105 = vfmadd231ps_avx512vl(auVar106,auVar98,auVar105);
      auVar97 = vmulps_avx512vl(local_3e0,auVar97);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_3c0,auVar99);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_3a0,auVar98);
      vandps_avx512vl(auVar97,auVar103);
      uVar16 = vcmpps_avx512vl(auVar97,auVar104,1);
      auVar98 = vxorps_avx512vl(auVar105,auVar90);
      auVar99 = vrcp14ps_avx512vl(auVar97);
      auVar90 = vxorps_avx512vl(auVar97,auVar90);
      auVar105 = vfnmadd213ps_avx512vl(auVar99,auVar97,auVar117);
      auVar74 = vfmadd132ps_fma(auVar105,auVar99,auVar99);
      fVar149 = auVar74._0_4_ * auVar98._0_4_;
      fVar168 = auVar74._4_4_ * auVar98._4_4_;
      auVar111._4_4_ = fVar168;
      auVar111._0_4_ = fVar149;
      fVar169 = auVar74._8_4_ * auVar98._8_4_;
      auVar111._8_4_ = fVar169;
      fVar170 = auVar74._12_4_ * auVar98._12_4_;
      auVar111._12_4_ = fVar170;
      fVar172 = auVar98._16_4_ * 0.0;
      auVar111._16_4_ = fVar172;
      fVar171 = auVar98._20_4_ * 0.0;
      auVar111._20_4_ = fVar171;
      fVar173 = auVar98._24_4_ * 0.0;
      auVar111._24_4_ = fVar173;
      auVar111._28_4_ = auVar98._28_4_;
      uVar18 = vcmpps_avx512vl(auVar97,auVar90,1);
      bVar53 = (byte)uVar16 | (byte)uVar18;
      auVar105 = vblendmps_avx512vl(auVar111,auVar118);
      auVar121._0_4_ =
           (uint)(bVar53 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar99._0_4_;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar57 * auVar105._4_4_ | (uint)!bVar57 * auVar99._4_4_;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar57 * auVar105._8_4_ | (uint)!bVar57 * auVar99._8_4_;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar57 * auVar105._12_4_ | (uint)!bVar57 * auVar99._12_4_;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar57 * auVar105._16_4_ | (uint)!bVar57 * auVar99._16_4_;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar57 * auVar105._20_4_ | (uint)!bVar57 * auVar99._20_4_;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar57 * auVar105._24_4_ | (uint)!bVar57 * auVar99._24_4_;
      auVar121._28_4_ =
           (uint)(bVar53 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar99._28_4_;
      local_380 = vmaxps_avx(auVar110,auVar121);
      uVar18 = vcmpps_avx512vl(auVar97,auVar90,6);
      bVar53 = (byte)uVar16 | (byte)uVar18;
      auVar122._0_4_ = (uint)(bVar53 & 1) * 0x7f800000 | (uint)!(bool)(bVar53 & 1) * (int)fVar149;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar168;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar169;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar170;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar172;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar171;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar173;
      auVar122._28_4_ =
           (uint)(bVar53 >> 7) * 0x7f800000 | (uint)!(bool)(bVar53 >> 7) * auVar98._28_4_;
      local_2a0 = vminps_avx(auVar102,auVar122);
      uVar16 = vcmpps_avx512vl(local_380,local_2a0,2);
      bVar47 = bVar47 & 0x7f & (byte)uVar16;
      if (bVar47 == 0) {
        auVar251 = ZEXT3264(local_840);
        goto LAB_0189aa0f;
      }
      auVar97 = vmaxps_avx512vl(auVar91,local_700);
      auVar90 = vfmadd213ps_avx512vl(local_500,auVar113,auVar93);
      fVar149 = auVar92._0_4_;
      fVar168 = auVar92._4_4_;
      auVar34._4_4_ = fVar168 * auVar90._4_4_;
      auVar34._0_4_ = fVar149 * auVar90._0_4_;
      fVar169 = auVar92._8_4_;
      auVar34._8_4_ = fVar169 * auVar90._8_4_;
      fVar170 = auVar92._12_4_;
      auVar34._12_4_ = fVar170 * auVar90._12_4_;
      fVar172 = auVar92._16_4_;
      auVar34._16_4_ = fVar172 * auVar90._16_4_;
      fVar171 = auVar92._20_4_;
      auVar34._20_4_ = fVar171 * auVar90._20_4_;
      fVar173 = auVar92._24_4_;
      auVar34._24_4_ = fVar173 * auVar90._24_4_;
      auVar34._28_4_ = auVar90._28_4_;
      auVar90 = vfmadd213ps_avx512vl(local_540,auVar113,auVar93);
      auVar35._4_4_ = fVar168 * auVar90._4_4_;
      auVar35._0_4_ = fVar149 * auVar90._0_4_;
      auVar35._8_4_ = fVar169 * auVar90._8_4_;
      auVar35._12_4_ = fVar170 * auVar90._12_4_;
      auVar35._16_4_ = fVar172 * auVar90._16_4_;
      auVar35._20_4_ = fVar171 * auVar90._20_4_;
      auVar35._24_4_ = fVar173 * auVar90._24_4_;
      auVar35._28_4_ = auVar90._28_4_;
      auVar90 = vminps_avx512vl(auVar34,auVar117);
      auVar43 = ZEXT812(0);
      auVar98 = ZEXT1232(auVar43) << 0x20;
      auVar90 = vmaxps_avx(auVar90,ZEXT1232(auVar43) << 0x20);
      auVar99 = vminps_avx512vl(auVar35,auVar117);
      auVar36._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar90._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar36,local_860,auVar201);
      auVar90 = vmaxps_avx(auVar99,ZEXT1232(auVar43) << 0x20);
      auVar37._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar90._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar37,local_860,auVar201);
      auVar38._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar38._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar38._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar38._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar38._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar38._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar38._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar38._28_4_ = auVar97._28_4_;
      auVar90 = vsubps_avx(local_820,auVar38);
      auVar39._4_4_ = auVar90._4_4_ * (float)local_4e0._4_4_;
      auVar39._0_4_ = auVar90._0_4_ * (float)local_4e0._0_4_;
      auVar39._8_4_ = auVar90._8_4_ * fStack_4d8;
      auVar39._12_4_ = auVar90._12_4_ * fStack_4d4;
      auVar39._16_4_ = auVar90._16_4_ * fStack_4d0;
      auVar39._20_4_ = auVar90._20_4_ * fStack_4cc;
      auVar39._24_4_ = auVar90._24_4_ * fStack_4c8;
      auVar39._28_4_ = auVar97._28_4_;
      auVar97 = vsubps_avx(local_6e0,auVar39);
      uVar16 = vcmpps_avx512vl(auVar97,ZEXT1232(auVar43) << 0x20,5);
      bVar53 = (byte)uVar16;
      auVar251 = ZEXT3264(local_840);
      auVar248 = ZEXT3264(local_880);
      if (bVar53 == 0) {
        bVar53 = 0;
        auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar228 = ZEXT864(0) << 0x20;
        auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar99 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar238 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar113._8_4_ = 0x7f800000;
        auVar113._0_8_ = 0x7f8000007f800000;
        auVar113._12_4_ = 0x7f800000;
        auVar113._16_4_ = 0x7f800000;
        auVar113._20_4_ = 0x7f800000;
        auVar113._24_4_ = 0x7f800000;
        auVar113._28_4_ = 0x7f800000;
        auVar114._8_4_ = 0xff800000;
        auVar114._0_8_ = 0xff800000ff800000;
        auVar114._12_4_ = 0xff800000;
        auVar114._16_4_ = 0xff800000;
        auVar114._20_4_ = 0xff800000;
        auVar114._24_4_ = 0xff800000;
        auVar114._28_4_ = 0xff800000;
      }
      else {
        auVar78 = vxorps_avx512vl(auVar216,auVar216);
        uVar60 = vcmpps_avx512vl(auVar97,auVar91,5);
        auVar97 = vsqrtps_avx(auVar97);
        auVar98 = vfnmadd213ps_avx512vl(local_640,local_660,auVar117);
        auVar74 = vfmadd132ps_fma(auVar98,local_660,local_660);
        auVar98 = vsubps_avx(local_520,auVar97);
        auVar40._4_4_ = auVar74._4_4_ * auVar98._4_4_;
        auVar40._0_4_ = auVar74._0_4_ * auVar98._0_4_;
        auVar40._8_4_ = auVar74._8_4_ * auVar98._8_4_;
        auVar40._12_4_ = auVar74._12_4_ * auVar98._12_4_;
        auVar40._16_4_ = auVar98._16_4_ * 0.0;
        auVar40._20_4_ = auVar98._20_4_ * 0.0;
        auVar40._24_4_ = auVar98._24_4_ * 0.0;
        auVar40._28_4_ = 0x3e000000;
        auVar97 = vsubps_avx512vl(auVar97,auVar114);
        auVar41._4_4_ = auVar74._4_4_ * auVar97._4_4_;
        auVar41._0_4_ = auVar74._0_4_ * auVar97._0_4_;
        auVar41._8_4_ = auVar74._8_4_ * auVar97._8_4_;
        auVar41._12_4_ = auVar74._12_4_ * auVar97._12_4_;
        auVar41._16_4_ = auVar97._16_4_ * 0.0;
        auVar41._20_4_ = auVar97._20_4_ * 0.0;
        auVar41._24_4_ = auVar97._24_4_ * 0.0;
        auVar41._28_4_ = auVar201._0_4_;
        auVar97 = vfmadd213ps_avx512vl(auVar113,auVar40,auVar93);
        auVar239._0_4_ = fVar149 * auVar97._0_4_;
        auVar239._4_4_ = fVar168 * auVar97._4_4_;
        auVar239._8_4_ = fVar169 * auVar97._8_4_;
        auVar239._12_4_ = fVar170 * auVar97._12_4_;
        auVar239._16_4_ = fVar172 * auVar97._16_4_;
        auVar239._20_4_ = fVar171 * auVar97._20_4_;
        auVar239._24_4_ = fVar173 * auVar97._24_4_;
        auVar239._28_4_ = 0;
        auVar97 = vmulps_avx512vl(local_3a0,auVar40);
        auVar98 = vmulps_avx512vl(local_3c0,auVar40);
        auVar105 = vmulps_avx512vl(local_3e0,auVar40);
        auVar99 = vfmadd213ps_avx512vl(auVar94,auVar239,auVar212);
        auVar97 = vsubps_avx512vl(auVar97,auVar99);
        auVar99 = vfmadd213ps_avx512vl(auVar95,auVar239,auVar100);
        auVar99 = vsubps_avx512vl(auVar98,auVar99);
        auVar74 = vfmadd213ps_fma(auVar239,auVar96,auVar101);
        auVar98 = vsubps_avx(auVar105,ZEXT1632(auVar74));
        auVar238 = auVar98._0_28_;
        auVar93 = vfmadd213ps_avx512vl(auVar113,auVar41,auVar93);
        auVar93 = vmulps_avx512vl(auVar92,auVar93);
        auVar247 = ZEXT3264(auVar93);
        auVar92 = vmulps_avx512vl(local_3a0,auVar41);
        auVar105 = vmulps_avx512vl(local_3c0,auVar41);
        auVar102 = vmulps_avx512vl(local_3e0,auVar41);
        auVar74 = vfmadd213ps_fma(auVar94,auVar93,auVar212);
        auVar98 = vsubps_avx(auVar92,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar95,auVar93,auVar100);
        auVar92 = vsubps_avx512vl(auVar105,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar96,auVar93,auVar101);
        auVar94 = vsubps_avx512vl(auVar102,ZEXT1632(auVar74));
        auVar228 = ZEXT3264(auVar94);
        auVar193._8_4_ = 0x7f800000;
        auVar193._0_8_ = 0x7f8000007f800000;
        auVar193._12_4_ = 0x7f800000;
        auVar193._16_4_ = 0x7f800000;
        auVar193._20_4_ = 0x7f800000;
        auVar193._24_4_ = 0x7f800000;
        auVar193._28_4_ = 0x7f800000;
        auVar94 = vblendmps_avx512vl(auVar193,auVar40);
        bVar57 = (bool)((byte)uVar60 & 1);
        auVar113._0_4_ = (uint)bVar57 * auVar94._0_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar57 * auVar94._4_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar57 * auVar94._8_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar57 * auVar94._12_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar113._16_4_ = (uint)bVar57 * auVar94._16_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar113._20_4_ = (uint)bVar57 * auVar94._20_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar113._24_4_ = (uint)bVar57 * auVar94._24_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = SUB81(uVar60 >> 7,0);
        auVar113._28_4_ = (uint)bVar57 * auVar94._28_4_ | (uint)!bVar57 * 0x7f800000;
        auVar213._8_4_ = 0xff800000;
        auVar213._0_8_ = 0xff800000ff800000;
        auVar213._12_4_ = 0xff800000;
        auVar213._16_4_ = 0xff800000;
        auVar213._20_4_ = 0xff800000;
        auVar213._24_4_ = 0xff800000;
        auVar213._28_4_ = 0xff800000;
        auVar94 = vblendmps_avx512vl(auVar213,auVar41);
        bVar57 = (bool)((byte)uVar60 & 1);
        auVar114._0_4_ = (uint)bVar57 * auVar94._0_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar57 * auVar94._4_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar57 * auVar94._8_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar57 * auVar94._12_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar114._16_4_ = (uint)bVar57 * auVar94._16_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar114._20_4_ = (uint)bVar57 * auVar94._20_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar114._24_4_ = (uint)bVar57 * auVar94._24_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = SUB81(uVar60 >> 7,0);
        auVar114._28_4_ = (uint)bVar57 * auVar94._28_4_ | (uint)!bVar57 * -0x800000;
        auVar212._8_4_ = 0x36000000;
        auVar212._0_8_ = 0x3600000036000000;
        auVar212._12_4_ = 0x36000000;
        auVar212._16_4_ = 0x36000000;
        auVar212._20_4_ = 0x36000000;
        auVar212._24_4_ = 0x36000000;
        auVar212._28_4_ = 0x36000000;
        auVar94 = vmulps_avx512vl(local_680,auVar212);
        uVar52 = vcmpps_avx512vl(auVar94,local_6a0,0xe);
        uVar60 = uVar60 & uVar52;
        bVar51 = (byte)uVar60;
        if (bVar51 != 0) {
          uVar52 = vcmpps_avx512vl(auVar90,ZEXT1632(auVar78),2);
          auVar230._8_4_ = 0x7f800000;
          auVar230._0_8_ = 0x7f8000007f800000;
          auVar230._12_4_ = 0x7f800000;
          auVar230._16_4_ = 0x7f800000;
          auVar230._20_4_ = 0x7f800000;
          auVar230._24_4_ = 0x7f800000;
          auVar230._28_4_ = 0x7f800000;
          auVar240._8_4_ = 0xff800000;
          auVar240._0_8_ = 0xff800000ff800000;
          auVar240._12_4_ = 0xff800000;
          auVar240._16_4_ = 0xff800000;
          auVar240._20_4_ = 0xff800000;
          auVar240._24_4_ = 0xff800000;
          auVar240._28_4_ = 0xff800000;
          auVar90 = vblendmps_avx512vl(auVar230,auVar240);
          bVar48 = (byte)uVar52;
          uVar61 = (uint)(bVar48 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar48 & 1) * auVar94._0_4_;
          bVar57 = (bool)((byte)(uVar52 >> 1) & 1);
          uVar128 = (uint)bVar57 * auVar90._4_4_ | (uint)!bVar57 * auVar94._4_4_;
          bVar57 = (bool)((byte)(uVar52 >> 2) & 1);
          uVar129 = (uint)bVar57 * auVar90._8_4_ | (uint)!bVar57 * auVar94._8_4_;
          bVar57 = (bool)((byte)(uVar52 >> 3) & 1);
          uVar130 = (uint)bVar57 * auVar90._12_4_ | (uint)!bVar57 * auVar94._12_4_;
          bVar57 = (bool)((byte)(uVar52 >> 4) & 1);
          uVar131 = (uint)bVar57 * auVar90._16_4_ | (uint)!bVar57 * auVar94._16_4_;
          bVar57 = (bool)((byte)(uVar52 >> 5) & 1);
          uVar132 = (uint)bVar57 * auVar90._20_4_ | (uint)!bVar57 * auVar94._20_4_;
          bVar57 = (bool)((byte)(uVar52 >> 6) & 1);
          uVar133 = (uint)bVar57 * auVar90._24_4_ | (uint)!bVar57 * auVar94._24_4_;
          bVar57 = SUB81(uVar52 >> 7,0);
          uVar134 = (uint)bVar57 * auVar90._28_4_ | (uint)!bVar57 * auVar94._28_4_;
          auVar113._0_4_ = (bVar51 & 1) * uVar61 | !(bool)(bVar51 & 1) * auVar113._0_4_;
          bVar57 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar113._4_4_ = bVar57 * uVar128 | !bVar57 * auVar113._4_4_;
          bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar113._8_4_ = bVar57 * uVar129 | !bVar57 * auVar113._8_4_;
          bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar113._12_4_ = bVar57 * uVar130 | !bVar57 * auVar113._12_4_;
          bVar57 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar113._16_4_ = bVar57 * uVar131 | !bVar57 * auVar113._16_4_;
          bVar57 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar113._20_4_ = bVar57 * uVar132 | !bVar57 * auVar113._20_4_;
          bVar57 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar113._24_4_ = bVar57 * uVar133 | !bVar57 * auVar113._24_4_;
          bVar57 = SUB81(uVar60 >> 7,0);
          auVar113._28_4_ = bVar57 * uVar134 | !bVar57 * auVar113._28_4_;
          auVar90 = vblendmps_avx512vl(auVar240,auVar230);
          bVar57 = (bool)((byte)(uVar52 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar52 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar52 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar52 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar52 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar52 >> 6) & 1);
          bVar12 = SUB81(uVar52 >> 7,0);
          auVar114._0_4_ =
               (uint)(bVar51 & 1) *
               ((uint)(bVar48 & 1) * auVar90._0_4_ | !(bool)(bVar48 & 1) * uVar61) |
               !(bool)(bVar51 & 1) * auVar114._0_4_;
          bVar6 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar114._4_4_ =
               (uint)bVar6 * ((uint)bVar57 * auVar90._4_4_ | !bVar57 * uVar128) |
               !bVar6 * auVar114._4_4_;
          bVar57 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar114._8_4_ =
               (uint)bVar57 * ((uint)bVar7 * auVar90._8_4_ | !bVar7 * uVar129) |
               !bVar57 * auVar114._8_4_;
          bVar57 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar114._12_4_ =
               (uint)bVar57 * ((uint)bVar8 * auVar90._12_4_ | !bVar8 * uVar130) |
               !bVar57 * auVar114._12_4_;
          bVar57 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar114._16_4_ =
               (uint)bVar57 * ((uint)bVar9 * auVar90._16_4_ | !bVar9 * uVar131) |
               !bVar57 * auVar114._16_4_;
          bVar57 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar114._20_4_ =
               (uint)bVar57 * ((uint)bVar10 * auVar90._20_4_ | !bVar10 * uVar132) |
               !bVar57 * auVar114._20_4_;
          bVar57 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar114._24_4_ =
               (uint)bVar57 * ((uint)bVar11 * auVar90._24_4_ | !bVar11 * uVar133) |
               !bVar57 * auVar114._24_4_;
          bVar57 = SUB81(uVar60 >> 7,0);
          auVar114._28_4_ =
               (uint)bVar57 * ((uint)bVar12 * auVar90._28_4_ | !bVar12 * uVar134) |
               !bVar57 * auVar114._28_4_;
          bVar53 = (~bVar51 | bVar48) & bVar53;
        }
      }
      auVar231._0_4_ = local_3e0._0_4_ * auVar228._0_4_;
      auVar231._4_4_ = local_3e0._4_4_ * auVar228._4_4_;
      auVar231._8_4_ = local_3e0._8_4_ * auVar228._8_4_;
      auVar231._12_4_ = local_3e0._12_4_ * auVar228._12_4_;
      auVar231._16_4_ = local_3e0._16_4_ * auVar228._16_4_;
      auVar231._20_4_ = local_3e0._20_4_ * auVar228._20_4_;
      auVar231._28_36_ = auVar228._28_36_;
      auVar231._24_4_ = local_3e0._24_4_ * auVar228._24_4_;
      auVar74 = vfmadd231ps_fma(auVar231._0_32_,local_3c0,auVar92);
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),local_3a0,auVar98);
      auVar229._8_4_ = 0x7fffffff;
      auVar229._0_8_ = 0x7fffffff7fffffff;
      auVar229._12_4_ = 0x7fffffff;
      auVar229._16_4_ = 0x7fffffff;
      auVar229._20_4_ = 0x7fffffff;
      auVar229._24_4_ = 0x7fffffff;
      auVar229._28_4_ = 0x7fffffff;
      auVar90 = vandps_avx(ZEXT1632(auVar74),auVar229);
      _local_1c0 = local_380;
      auVar227._8_4_ = 0x3e99999a;
      auVar227._0_8_ = 0x3e99999a3e99999a;
      auVar227._12_4_ = 0x3e99999a;
      auVar227._16_4_ = 0x3e99999a;
      auVar227._20_4_ = 0x3e99999a;
      auVar227._24_4_ = 0x3e99999a;
      auVar227._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar90,auVar227,1);
      _local_2c0 = vmaxps_avx(local_380,auVar114);
      auVar90 = vminps_avx(local_2a0,auVar113);
      uVar18 = vcmpps_avx512vl(local_380,auVar90,2);
      bVar51 = (byte)uVar18 & bVar47;
      uVar17 = vcmpps_avx512vl(_local_2c0,local_2a0,2);
      if ((bVar47 & ((byte)uVar17 | (byte)uVar18)) == 0) {
        auVar221 = ZEXT3264(auVar229);
        auVar249 = ZEXT3264(local_720);
        auVar250 = ZEXT3264(local_740);
        auVar231 = ZEXT3264(local_760);
        auVar235 = ZEXT3264(local_780);
        auVar241 = ZEXT3264(local_7a0);
        auVar228 = ZEXT3264(local_7c0);
      }
      else {
        _local_340 = _local_2c0;
        local_890 = (uint)(byte)((byte)uVar16 | ~bVar53);
        auVar42._4_4_ = local_3e0._4_4_ * auVar238._4_4_;
        auVar42._0_4_ = local_3e0._0_4_ * auVar238._0_4_;
        auVar42._8_4_ = local_3e0._8_4_ * auVar238._8_4_;
        auVar42._12_4_ = local_3e0._12_4_ * auVar238._12_4_;
        auVar42._16_4_ = local_3e0._16_4_ * auVar238._16_4_;
        auVar42._20_4_ = local_3e0._20_4_ * auVar238._20_4_;
        auVar42._24_4_ = local_3e0._24_4_ * auVar238._24_4_;
        auVar42._28_4_ = auVar90._28_4_;
        auVar74 = vfmadd213ps_fma(auVar99,local_3c0,auVar42);
        auVar74 = vfmadd213ps_fma(auVar97,local_3a0,ZEXT1632(auVar74));
        auVar90 = vandps_avx(ZEXT1632(auVar74),auVar229);
        uVar16 = vcmpps_avx512vl(auVar90,auVar227,1);
        bVar53 = (byte)uVar16 | ~bVar53;
        auVar144._8_4_ = 2;
        auVar144._0_8_ = 0x200000002;
        auVar144._12_4_ = 2;
        auVar144._16_4_ = 2;
        auVar144._20_4_ = 2;
        auVar144._24_4_ = 2;
        auVar144._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar90 = vpblendmd_avx512vl(auVar144,auVar31);
        local_280._0_4_ = (uint)(bVar53 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar53 & 1) * 2;
        bVar57 = (bool)(bVar53 >> 1 & 1);
        local_280._4_4_ = (uint)bVar57 * auVar90._4_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 2 & 1);
        local_280._8_4_ = (uint)bVar57 * auVar90._8_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 3 & 1);
        local_280._12_4_ = (uint)bVar57 * auVar90._12_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 4 & 1);
        local_280._16_4_ = (uint)bVar57 * auVar90._16_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 5 & 1);
        local_280._20_4_ = (uint)bVar57 * auVar90._20_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 6 & 1);
        local_280._24_4_ = (uint)bVar57 * auVar90._24_4_ | (uint)!bVar57 * 2;
        local_280._28_4_ = (uint)(bVar53 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar53 >> 7) * 2;
        local_2e0 = vpbroadcastd_avx512vl();
        uVar16 = vpcmpd_avx512vl(local_2e0,local_280,5);
        local_88c = (uint)bVar51;
        local_320 = local_380._0_4_ + (float)local_360._0_4_;
        fStack_31c = local_380._4_4_ + (float)local_360._4_4_;
        fStack_318 = local_380._8_4_ + fStack_358;
        fStack_314 = local_380._12_4_ + fStack_354;
        fStack_310 = local_380._16_4_ + fStack_350;
        fStack_30c = local_380._20_4_ + fStack_34c;
        fStack_308 = local_380._24_4_ + fStack_348;
        fStack_304 = local_380._28_4_ + fStack_344;
        for (bVar51 = (byte)uVar16 & bVar51; bVar51 != 0; bVar51 = ~bVar53 & bVar51 & (byte)uVar16)
        {
          auVar145._8_4_ = 0x7f800000;
          auVar145._0_8_ = 0x7f8000007f800000;
          auVar145._12_4_ = 0x7f800000;
          auVar145._16_4_ = 0x7f800000;
          auVar145._20_4_ = 0x7f800000;
          auVar145._24_4_ = 0x7f800000;
          auVar145._28_4_ = 0x7f800000;
          auVar90 = vblendmps_avx512vl(auVar145,local_380);
          auVar124._0_4_ =
               (uint)(bVar51 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar51 & 1) * 0x7f800000;
          bVar57 = (bool)(bVar51 >> 1 & 1);
          auVar124._4_4_ = (uint)bVar57 * auVar90._4_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar51 >> 2 & 1);
          auVar124._8_4_ = (uint)bVar57 * auVar90._8_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar51 >> 3 & 1);
          auVar124._12_4_ = (uint)bVar57 * auVar90._12_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar51 >> 4 & 1);
          auVar124._16_4_ = (uint)bVar57 * auVar90._16_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar51 >> 5 & 1);
          auVar124._20_4_ = (uint)bVar57 * auVar90._20_4_ | (uint)!bVar57 * 0x7f800000;
          auVar124._24_4_ =
               (uint)(bVar51 >> 6) * auVar90._24_4_ | (uint)!(bool)(bVar51 >> 6) * 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar90 = vshufps_avx(auVar124,auVar124,0xb1);
          auVar90 = vminps_avx(auVar124,auVar90);
          auVar92 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vminps_avx(auVar90,auVar92);
          auVar92 = vpermpd_avx2(auVar90,0x4e);
          auVar90 = vminps_avx(auVar90,auVar92);
          uVar16 = vcmpps_avx512vl(auVar124,auVar90,0);
          bVar48 = (byte)uVar16 & bVar51;
          bVar53 = bVar51;
          if (bVar48 != 0) {
            bVar53 = bVar48;
          }
          iVar19 = 0;
          for (uVar61 = (uint)bVar53; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
            iVar19 = iVar19 + 1;
          }
          bVar53 = '\x01' << ((byte)iVar19 & 0x1f);
          fVar169 = local_888;
          fVar168 = *(float *)(local_1e0 + (uint)(iVar19 << 2));
          uVar150 = 0;
          uVar232 = 0;
          uVar233 = 0;
          fVar149 = *(float *)(local_1c0 + (uint)(iVar19 << 2));
          uVar242 = 0;
          uVar236 = 0;
          uVar237 = 0;
          if ((float)local_6c0._0_4_ < 0.0) {
            local_820._0_16_ = ZEXT416((uint)*(float *)(local_1e0 + (uint)(iVar19 << 2)));
            local_6e0._0_16_ = ZEXT416((uint)*(float *)(local_1c0 + (uint)(iVar19 << 2)));
            auVar247 = ZEXT1664(auVar247._0_16_);
            fVar169 = sqrtf((float)local_6c0._0_4_);
            auVar248 = ZEXT3264(local_880);
            auVar251 = ZEXT3264(local_840);
            fVar168 = (float)local_820._0_4_;
            uVar150 = local_820._4_4_;
            uVar232 = local_820._8_4_;
            uVar233 = local_820._12_4_;
            fVar149 = (float)local_6e0._0_4_;
            uVar242 = local_6e0._4_4_;
            uVar236 = local_6e0._8_4_;
            uVar237 = local_6e0._12_4_;
          }
          uVar60 = (ulong)bVar53;
          auVar78 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar74 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar75 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar79 = vminps_avx(auVar78,auVar75);
          auVar78 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar75 = vmaxps_avx(auVar74,auVar78);
          auVar197._8_4_ = 0x7fffffff;
          auVar197._0_8_ = 0x7fffffff7fffffff;
          auVar197._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar79,auVar197);
          auVar78 = vandps_avx(auVar75,auVar197);
          auVar74 = vmaxps_avx(auVar74,auVar78);
          auVar78 = vmovshdup_avx(auVar74);
          auVar78 = vmaxss_avx(auVar78,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar78);
          local_6a0._0_4_ = auVar74._0_4_ * 1.9073486e-06;
          local_600 = vshufps_avx(auVar75,auVar75,0xff);
          uVar52 = 0;
          while( true ) {
            auVar92 = local_6e0;
            auVar90 = local_820;
            bVar48 = (byte)uVar60;
            if (uVar52 == 5) break;
            auVar137._4_4_ = fVar149;
            auVar137._0_4_ = fVar149;
            auVar137._8_4_ = fVar149;
            auVar137._12_4_ = fVar149;
            auVar78 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_6b0);
            fVar170 = 1.0 - fVar168;
            auVar176._0_4_ = local_5a0._0_4_ * fVar168;
            auVar176._4_4_ = local_5a0._4_4_ * fVar168;
            auVar176._8_4_ = local_5a0._8_4_ * fVar168;
            auVar176._12_4_ = local_5a0._12_4_ * fVar168;
            local_500._0_16_ = ZEXT416((uint)fVar170);
            auVar198._4_4_ = fVar170;
            auVar198._0_4_ = fVar170;
            auVar198._8_4_ = fVar170;
            auVar198._12_4_ = fVar170;
            auVar74 = vfmadd231ps_fma(auVar176,auVar198,local_560._0_16_);
            auVar206._0_4_ = local_580._0_4_ * fVar168;
            auVar206._4_4_ = local_580._4_4_ * fVar168;
            auVar206._8_4_ = local_580._8_4_ * fVar168;
            auVar206._12_4_ = local_580._12_4_ * fVar168;
            auVar75 = vfmadd231ps_fma(auVar206,auVar198,local_5a0._0_16_);
            auVar217._0_4_ = fVar168 * (float)local_5c0._0_4_;
            auVar217._4_4_ = fVar168 * (float)local_5c0._4_4_;
            auVar217._8_4_ = fVar168 * fStack_5b8;
            auVar217._12_4_ = fVar168 * fStack_5b4;
            auVar79 = vfmadd231ps_fma(auVar217,auVar198,local_580._0_16_);
            auVar225._0_4_ = fVar168 * auVar75._0_4_;
            auVar225._4_4_ = fVar168 * auVar75._4_4_;
            auVar225._8_4_ = fVar168 * auVar75._8_4_;
            auVar225._12_4_ = fVar168 * auVar75._12_4_;
            auVar74 = vfmadd231ps_fma(auVar225,auVar198,auVar74);
            auVar177._0_4_ = fVar168 * auVar79._0_4_;
            auVar177._4_4_ = fVar168 * auVar79._4_4_;
            auVar177._8_4_ = fVar168 * auVar79._8_4_;
            auVar177._12_4_ = fVar168 * auVar79._12_4_;
            auVar75 = vfmadd231ps_fma(auVar177,auVar198,auVar75);
            auVar207._0_4_ = fVar168 * auVar75._0_4_;
            auVar207._4_4_ = fVar168 * auVar75._4_4_;
            auVar207._8_4_ = fVar168 * auVar75._8_4_;
            auVar207._12_4_ = fVar168 * auVar75._12_4_;
            auVar79 = vfmadd231ps_fma(auVar207,auVar74,auVar198);
            auVar74 = vsubps_avx(auVar75,auVar74);
            auVar20._8_4_ = 0x40400000;
            auVar20._0_8_ = 0x4040000040400000;
            auVar20._12_4_ = 0x40400000;
            auVar75 = vmulps_avx512vl(auVar74,auVar20);
            _local_4e0 = auVar79;
            auVar74 = vsubps_avx(auVar78,auVar79);
            local_860._0_16_ = auVar74;
            auVar74 = vdpps_avx(auVar74,auVar74,0x7f);
            local_700._0_16_ = auVar74;
            local_820._4_4_ = uVar150;
            local_820._0_4_ = fVar168;
            local_820._8_4_ = uVar232;
            local_820._16_16_ = auVar90._16_16_;
            local_820._12_4_ = uVar233;
            local_6e0._4_4_ = uVar242;
            local_6e0._0_4_ = fVar149;
            local_6e0._8_4_ = uVar236;
            local_6e0._16_16_ = auVar92._16_16_;
            local_6e0._12_4_ = uVar237;
            if (auVar74._0_4_ < 0.0) {
              auVar228._0_4_ = sqrtf(auVar74._0_4_);
              auVar228._4_60_ = extraout_var;
              auVar74 = auVar228._0_16_;
              uVar60 = extraout_RAX;
            }
            else {
              auVar74 = vsqrtss_avx(auVar74,auVar74);
            }
            local_660._0_16_ = vdpps_avx(auVar75,auVar75,0x7f);
            fVar149 = local_660._0_4_;
            auVar178._4_12_ = ZEXT812(0) << 0x20;
            auVar178._0_4_ = fVar149;
            local_680._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
            fVar168 = local_680._0_4_;
            local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar79 = vxorps_avx512vl(local_660._0_16_,auVar21);
            auVar78 = vfnmadd213ss_fma(local_520._0_16_,local_660._0_16_,ZEXT416(0x40000000));
            local_540._0_4_ = auVar78._0_4_;
            local_640._0_4_ = auVar74._0_4_;
            if (fVar149 < auVar79._0_4_) {
              auVar235._0_4_ = sqrtf(fVar149);
              auVar235._4_60_ = extraout_var_00;
              auVar74 = ZEXT416((uint)local_640._0_4_);
              auVar78 = auVar235._0_16_;
              uVar60 = extraout_RAX_00;
            }
            else {
              auVar78 = vsqrtss_avx(local_660._0_16_,local_660._0_16_);
            }
            auVar247 = ZEXT1664(auVar78);
            fVar170 = local_680._0_4_;
            fVar149 = fVar168 * 1.5 + fVar149 * -0.5 * fVar170 * fVar170 * fVar170;
            local_680._0_4_ = auVar75._0_4_ * fVar149;
            local_680._4_4_ = auVar75._4_4_ * fVar149;
            local_680._8_4_ = auVar75._8_4_ * fVar149;
            local_680._12_4_ = auVar75._12_4_ * fVar149;
            auVar79 = vdpps_avx(local_860._0_16_,local_680._0_16_,0x7f);
            fVar172 = auVar74._0_4_;
            fVar170 = auVar79._0_4_;
            auVar138._0_4_ = fVar170 * fVar170;
            auVar138._4_4_ = auVar79._4_4_ * auVar79._4_4_;
            auVar138._8_4_ = auVar79._8_4_ * auVar79._8_4_;
            auVar138._12_4_ = auVar79._12_4_ * auVar79._12_4_;
            auVar80 = vsubps_avx512vl(local_700._0_16_,auVar138);
            fVar168 = auVar80._0_4_;
            auVar156._4_12_ = ZEXT812(0) << 0x20;
            auVar156._0_4_ = fVar168;
            auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar156);
            auVar82 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
            auVar71 = vmulss_avx512f(auVar80,ZEXT416(0xbf000000));
            if (fVar168 < 0.0) {
              local_5f0 = fVar149;
              fStack_5ec = fVar149;
              fStack_5e8 = fVar149;
              fStack_5e4 = fVar149;
              local_5e0 = auVar81;
              fVar171 = sqrtf(fVar168);
              auVar71 = ZEXT416(auVar71._0_4_);
              auVar82 = ZEXT416(auVar82._0_4_);
              auVar247 = ZEXT464(auVar78._0_4_);
              auVar74 = ZEXT416((uint)local_640._0_4_);
              uVar60 = extraout_RAX_01;
              auVar81 = local_5e0;
              fVar149 = local_5f0;
              fVar168 = fStack_5ec;
              fVar173 = fStack_5e8;
              fVar174 = fStack_5e4;
            }
            else {
              auVar78 = vsqrtss_avx(auVar80,auVar80);
              fVar171 = auVar78._0_4_;
              fVar168 = fVar149;
              fVar173 = fVar149;
              fVar174 = fVar149;
            }
            auVar251 = ZEXT3264(local_840);
            auVar248 = ZEXT3264(local_880);
            auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,
                                      local_500._0_16_);
            fVar151 = auVar78._0_4_ * 6.0;
            fVar14 = local_820._0_4_ * 6.0;
            auVar179._0_4_ = fVar14 * (float)local_5c0._0_4_;
            auVar179._4_4_ = fVar14 * (float)local_5c0._4_4_;
            auVar179._8_4_ = fVar14 * fStack_5b8;
            auVar179._12_4_ = fVar14 * fStack_5b4;
            auVar157._4_4_ = fVar151;
            auVar157._0_4_ = fVar151;
            auVar157._8_4_ = fVar151;
            auVar157._12_4_ = fVar151;
            auVar78 = vfmadd132ps_fma(auVar157,auVar179,local_580._0_16_);
            auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_500._0_16_,
                                      local_820._0_16_);
            fVar151 = auVar80._0_4_ * 6.0;
            auVar180._4_4_ = fVar151;
            auVar180._0_4_ = fVar151;
            auVar180._8_4_ = fVar151;
            auVar180._12_4_ = fVar151;
            auVar78 = vfmadd132ps_fma(auVar180,auVar78,local_5a0._0_16_);
            fVar151 = local_500._0_4_ * 6.0;
            auVar158._4_4_ = fVar151;
            auVar158._0_4_ = fVar151;
            auVar158._8_4_ = fVar151;
            auVar158._12_4_ = fVar151;
            auVar78 = vfmadd132ps_fma(auVar158,auVar78,local_560._0_16_);
            auVar181._0_4_ = auVar78._0_4_ * (float)local_660._0_4_;
            auVar181._4_4_ = auVar78._4_4_ * (float)local_660._0_4_;
            auVar181._8_4_ = auVar78._8_4_ * (float)local_660._0_4_;
            auVar181._12_4_ = auVar78._12_4_ * (float)local_660._0_4_;
            auVar78 = vdpps_avx(auVar75,auVar78,0x7f);
            fVar151 = auVar78._0_4_;
            auVar159._0_4_ = auVar75._0_4_ * fVar151;
            auVar159._4_4_ = auVar75._4_4_ * fVar151;
            auVar159._8_4_ = auVar75._8_4_ * fVar151;
            auVar159._12_4_ = auVar75._12_4_ * fVar151;
            auVar78 = vsubps_avx(auVar181,auVar159);
            fVar151 = (float)local_540._0_4_ * (float)local_520._0_4_;
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar126._16_16_ = local_880._16_16_;
            auVar68 = vxorps_avx512vl(auVar75,auVar22);
            auVar208._0_4_ = fVar149 * auVar78._0_4_ * fVar151;
            auVar208._4_4_ = fVar168 * auVar78._4_4_ * fVar151;
            auVar208._8_4_ = fVar173 * auVar78._8_4_ * fVar151;
            auVar208._12_4_ = fVar174 * auVar78._12_4_ * fVar151;
            auVar78 = vdpps_avx(auVar68,local_680._0_16_,0x7f);
            auVar66 = vmaxss_avx(ZEXT416((uint)local_6a0._0_4_),
                                 ZEXT416((uint)((float)local_6e0._0_4_ * fVar169 * 1.9073486e-06)));
            auVar80 = vdpps_avx(local_860._0_16_,auVar208,0x7f);
            auVar74 = vfmadd213ss_fma(auVar74,ZEXT416((uint)local_6a0._0_4_),auVar66);
            auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar172 + 1.0)),
                                      ZEXT416((uint)((float)local_6a0._0_4_ / auVar247._0_4_)),
                                      auVar74);
            auVar74 = vdpps_avx(local_6b0,local_680._0_16_,0x7f);
            fVar149 = auVar78._0_4_ + auVar80._0_4_;
            auVar78 = vdpps_avx(local_860._0_16_,auVar68,0x7f);
            auVar80 = vmulss_avx512f(auVar71,auVar81);
            auVar71 = vmulss_avx512f(auVar81,auVar81);
            auVar81 = vdpps_avx(local_860._0_16_,local_6b0,0x7f);
            auVar71 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar80._0_4_ * auVar71._0_4_)));
            auVar80 = vfnmadd231ss_fma(auVar78,auVar79,ZEXT416((uint)fVar149));
            auVar82 = vfnmadd231ss_fma(auVar81,auVar79,auVar74);
            auVar78 = vpermilps_avx(_local_4e0,0xff);
            fVar171 = fVar171 - auVar78._0_4_;
            auVar78 = vshufps_avx(auVar75,auVar75,0xff);
            auVar81 = vfmsub213ss_fma(auVar80,auVar71,auVar78);
            fVar168 = auVar82._0_4_ * auVar71._0_4_;
            auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar81._0_4_)),
                                      ZEXT416((uint)fVar149),ZEXT416((uint)fVar168));
            fVar172 = auVar80._0_4_;
            fVar168 = local_820._0_4_ -
                      (fVar170 * (fVar168 / fVar172) - fVar171 * (auVar74._0_4_ / fVar172));
            uVar150 = 0;
            uVar232 = 0;
            uVar233 = 0;
            fVar149 = (float)local_6e0._0_4_ -
                      (fVar171 * (fVar149 / fVar172) - fVar170 * (auVar81._0_4_ / fVar172));
            uVar242 = 0;
            uVar236 = 0;
            uVar237 = 0;
            auVar23._8_4_ = 0x7fffffff;
            auVar23._0_8_ = 0x7fffffff7fffffff;
            auVar23._12_4_ = 0x7fffffff;
            auVar74 = vandps_avx512vl(auVar79,auVar23);
            if (auVar74._0_4_ < auVar67._0_4_) {
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ + auVar66._0_4_)),local_600,
                                        ZEXT416(0x36000000));
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(ZEXT416((uint)fVar171),auVar24);
              if (auVar79._0_4_ < auVar74._0_4_) {
                bVar57 = uVar52 < 5;
                fVar149 = fVar149 + (float)local_610._0_4_;
                if (fVar149 < fVar13) {
LAB_0189b418:
                  bVar48 = 0;
                  goto LAB_0189b420;
                }
                fVar169 = *(float *)(ray + k * 4 + 0x80);
                if (fVar149 <= fVar169) {
                  bVar48 = 0;
                  if ((fVar168 < 0.0) || (1.0 < fVar168)) goto LAB_0189b420;
                  auVar126._0_16_ = ZEXT816(0) << 0x20;
                  auVar125._4_28_ = auVar126._4_28_;
                  auVar125._0_4_ = local_700._0_4_;
                  auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar125._0_16_);
                  fVar170 = auVar74._0_4_;
                  auVar74 = vmulss_avx512f(local_700._0_16_,ZEXT416(0xbf000000));
                  pGVar54 = (context->scene->geometries).items[local_7f8].ptr;
                  if ((pGVar54->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0189b418;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar48 = 1, pGVar54->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_0189b420;
                  fVar170 = fVar170 * 1.5 + auVar74._0_4_ * fVar170 * fVar170 * fVar170;
                  auVar182._0_4_ = local_860._0_4_ * fVar170;
                  auVar182._4_4_ = local_860._4_4_ * fVar170;
                  auVar182._8_4_ = local_860._8_4_ * fVar170;
                  auVar182._12_4_ = local_860._12_4_ * fVar170;
                  auVar79 = vfmadd213ps_fma(auVar78,auVar182,auVar75);
                  auVar74 = vshufps_avx(auVar182,auVar182,0xc9);
                  auVar78 = vshufps_avx(auVar75,auVar75,0xc9);
                  auVar183._0_4_ = auVar182._0_4_ * auVar78._0_4_;
                  auVar183._4_4_ = auVar182._4_4_ * auVar78._4_4_;
                  auVar183._8_4_ = auVar182._8_4_ * auVar78._8_4_;
                  auVar183._12_4_ = auVar182._12_4_ * auVar78._12_4_;
                  auVar75 = vfmsub231ps_fma(auVar183,auVar75,auVar74);
                  auVar74 = vshufps_avx(auVar75,auVar75,0xc9);
                  auVar78 = vshufps_avx(auVar79,auVar79,0xc9);
                  auVar75 = vshufps_avx(auVar75,auVar75,0xd2);
                  auVar139._0_4_ = auVar79._0_4_ * auVar75._0_4_;
                  auVar139._4_4_ = auVar79._4_4_ * auVar75._4_4_;
                  auVar139._8_4_ = auVar79._8_4_ * auVar75._8_4_;
                  auVar139._12_4_ = auVar79._12_4_ * auVar75._12_4_;
                  auVar74 = vfmsub231ps_fma(auVar139,auVar74,auVar78);
                  local_480 = (RTCHitN  [16])vshufps_avx(auVar74,auVar74,0x55);
                  auStack_470 = vshufps_avx(auVar74,auVar74,0xaa);
                  local_460 = auVar74._0_4_;
                  uStack_45c = local_460;
                  uStack_458 = local_460;
                  uStack_454 = local_460;
                  local_450 = fVar168;
                  fStack_44c = fVar168;
                  fStack_448 = fVar168;
                  fStack_444 = fVar168;
                  local_440 = ZEXT416(0) << 0x20;
                  local_430 = local_490._0_8_;
                  uStack_428 = local_490._8_8_;
                  local_420 = local_4a0;
                  vpcmpeqd_avx2(ZEXT1632(local_4a0),ZEXT1632(local_4a0));
                  uStack_40c = context->user->instID[0];
                  local_410 = uStack_40c;
                  uStack_408 = uStack_40c;
                  uStack_404 = uStack_40c;
                  uStack_400 = context->user->instPrimID[0];
                  uStack_3fc = uStack_400;
                  uStack_3f8 = uStack_400;
                  uStack_3f4 = uStack_400;
                  *(float *)(ray + k * 4 + 0x80) = fVar149;
                  local_8a0 = local_4b0;
                  local_7f0.valid = (int *)local_8a0;
                  local_7f0.geometryUserPtr = pGVar54->userPtr;
                  local_7f0.context = context->user;
                  local_7f0.hit = local_480;
                  local_7f0.N = 4;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar54->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_860._0_8_ = pGVar54;
                    auVar247 = ZEXT1664(auVar247._0_16_);
                    (*pGVar54->occlusionFilterN)(&local_7f0);
                    auVar248 = ZEXT3264(local_880);
                    auVar251 = ZEXT3264(local_840);
                    pGVar54 = (Geometry *)local_860._0_8_;
                  }
                  uVar60 = vptestmd_avx512vl(local_8a0,local_8a0);
                  if ((uVar60 & 0xf) != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar54->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      (*p_Var5)(&local_7f0);
                      auVar248 = ZEXT3264(local_880);
                      auVar251 = ZEXT3264(local_840);
                    }
                    uVar60 = vptestmd_avx512vl(local_8a0,local_8a0);
                    uVar60 = uVar60 & 0xf;
                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar6 = (bool)((byte)uVar60 & 1);
                    bVar7 = (bool)((byte)(uVar60 >> 1) & 1);
                    bVar8 = (bool)((byte)(uVar60 >> 2) & 1);
                    bVar9 = SUB81(uVar60 >> 3,0);
                    *(uint *)(local_7f0.ray + 0x80) =
                         (uint)bVar6 * auVar74._0_4_ | (uint)!bVar6 * *(int *)(local_7f0.ray + 0x80)
                    ;
                    *(uint *)(local_7f0.ray + 0x84) =
                         (uint)bVar7 * auVar74._4_4_ | (uint)!bVar7 * *(int *)(local_7f0.ray + 0x84)
                    ;
                    *(uint *)(local_7f0.ray + 0x88) =
                         (uint)bVar8 * auVar74._8_4_ | (uint)!bVar8 * *(int *)(local_7f0.ray + 0x88)
                    ;
                    *(uint *)(local_7f0.ray + 0x8c) =
                         (uint)bVar9 * auVar74._12_4_ |
                         (uint)!bVar9 * *(int *)(local_7f0.ray + 0x8c);
                    bVar48 = 1;
                    if ((byte)uVar60 != 0) goto LAB_0189b420;
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar169;
                }
                bVar48 = 0;
                goto LAB_0189b420;
              }
            }
            uVar52 = uVar52 + 1;
          }
          bVar57 = false;
LAB_0189b420:
          bVar49 = bVar49 | bVar57 & bVar48;
          uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar219._4_4_ = uVar150;
          auVar219._0_4_ = uVar150;
          auVar219._8_4_ = uVar150;
          auVar219._12_4_ = uVar150;
          auVar219._16_4_ = uVar150;
          auVar219._20_4_ = uVar150;
          auVar219._24_4_ = uVar150;
          auVar219._28_4_ = uVar150;
          auVar221 = ZEXT3264(auVar219);
          auVar44._4_4_ = fStack_31c;
          auVar44._0_4_ = local_320;
          auVar44._8_4_ = fStack_318;
          auVar44._12_4_ = fStack_314;
          auVar44._16_4_ = fStack_310;
          auVar44._20_4_ = fStack_30c;
          auVar44._24_4_ = fStack_308;
          auVar44._28_4_ = fStack_304;
          uVar16 = vcmpps_avx512vl(auVar219,auVar44,0xd);
        }
        auVar146._0_4_ = (float)local_360._0_4_ + (float)local_340._0_4_;
        auVar146._4_4_ = (float)local_360._4_4_ + (float)local_340._4_4_;
        auVar146._8_4_ = fStack_358 + fStack_338;
        auVar146._12_4_ = fStack_354 + fStack_334;
        auVar146._16_4_ = fStack_350 + fStack_330;
        auVar146._20_4_ = fStack_34c + fStack_32c;
        auVar146._24_4_ = fStack_348 + fStack_328;
        auVar146._28_4_ = fStack_344 + fStack_324;
        uVar150 = auVar221._0_4_;
        auVar166._4_4_ = uVar150;
        auVar166._0_4_ = uVar150;
        auVar166._8_4_ = uVar150;
        auVar166._12_4_ = uVar150;
        auVar166._16_4_ = uVar150;
        auVar166._20_4_ = uVar150;
        auVar166._24_4_ = uVar150;
        auVar166._28_4_ = uVar150;
        uVar16 = vcmpps_avx512vl(auVar146,auVar166,2);
        auVar147._8_4_ = 2;
        auVar147._0_8_ = 0x200000002;
        auVar147._12_4_ = 2;
        auVar147._16_4_ = 2;
        auVar147._20_4_ = 2;
        auVar147._24_4_ = 2;
        auVar147._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar90 = vpblendmd_avx512vl(auVar147,auVar32);
        bVar57 = (bool)((byte)local_890 & 1);
        local_340._0_4_ = (uint)bVar57 * auVar90._0_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)((byte)(local_890 >> 1) & 1);
        local_340._4_4_ = (uint)bVar57 * auVar90._4_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)((byte)(local_890 >> 2) & 1);
        fStack_338 = (float)((uint)bVar57 * auVar90._8_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)((byte)(local_890 >> 3) & 1);
        fStack_334 = (float)((uint)bVar57 * auVar90._12_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)((byte)(local_890 >> 4) & 1);
        fStack_330 = (float)((uint)bVar57 * auVar90._16_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)((byte)(local_890 >> 5) & 1);
        fStack_32c = (float)((uint)bVar57 * auVar90._20_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)((byte)(local_890 >> 6) & 1);
        fStack_328 = (float)((uint)bVar57 * auVar90._24_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)((byte)(local_890 >> 7) & 1);
        fStack_324 = (float)((uint)bVar57 * auVar90._28_4_ | (uint)!bVar57 * 2);
        bVar47 = (byte)uVar17 & bVar47 & (byte)uVar16;
        uVar16 = vpcmpd_avx512vl(_local_340,local_2e0,2);
        local_380 = _local_2c0;
        local_320 = (float)local_360._0_4_ + (float)local_2c0._0_4_;
        fStack_31c = (float)local_360._4_4_ + (float)local_2c0._4_4_;
        fStack_318 = fStack_358 + fStack_2b8;
        fStack_314 = fStack_354 + fStack_2b4;
        fStack_310 = fStack_350 + fStack_2b0;
        fStack_30c = fStack_34c + fStack_2ac;
        fStack_308 = fStack_348 + fStack_2a8;
        fStack_304 = fStack_344 + fStack_2a4;
        auVar249 = ZEXT3264(local_720);
        auVar250 = ZEXT3264(local_740);
        auVar231 = ZEXT3264(local_760);
        auVar235 = ZEXT3264(local_780);
        auVar241 = ZEXT3264(local_7a0);
        auVar228 = ZEXT3264(local_7c0);
        for (bVar53 = (byte)uVar16 & bVar47; bVar53 != 0; bVar53 = ~bVar51 & bVar53 & (byte)uVar16)
        {
          auVar148._8_4_ = 0x7f800000;
          auVar148._0_8_ = 0x7f8000007f800000;
          auVar148._12_4_ = 0x7f800000;
          auVar148._16_4_ = 0x7f800000;
          auVar148._20_4_ = 0x7f800000;
          auVar148._24_4_ = 0x7f800000;
          auVar148._28_4_ = 0x7f800000;
          auVar90 = vblendmps_avx512vl(auVar148,local_380);
          auVar127._0_4_ =
               (uint)(bVar53 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 1 & 1);
          auVar127._4_4_ = (uint)bVar57 * auVar90._4_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 2 & 1);
          auVar127._8_4_ = (uint)bVar57 * auVar90._8_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 3 & 1);
          auVar127._12_4_ = (uint)bVar57 * auVar90._12_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 4 & 1);
          auVar127._16_4_ = (uint)bVar57 * auVar90._16_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 5 & 1);
          auVar127._20_4_ = (uint)bVar57 * auVar90._20_4_ | (uint)!bVar57 * 0x7f800000;
          auVar127._24_4_ =
               (uint)(bVar53 >> 6) * auVar90._24_4_ | (uint)!(bool)(bVar53 >> 6) * 0x7f800000;
          auVar127._28_4_ = 0x7f800000;
          auVar90 = vshufps_avx(auVar127,auVar127,0xb1);
          auVar90 = vminps_avx(auVar127,auVar90);
          auVar92 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vminps_avx(auVar90,auVar92);
          auVar92 = vpermpd_avx2(auVar90,0x4e);
          auVar90 = vminps_avx(auVar90,auVar92);
          uVar16 = vcmpps_avx512vl(auVar127,auVar90,0);
          bVar48 = (byte)uVar16 & bVar53;
          bVar51 = bVar53;
          if (bVar48 != 0) {
            bVar51 = bVar48;
          }
          iVar19 = 0;
          for (uVar61 = (uint)bVar51; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
            iVar19 = iVar19 + 1;
          }
          bVar51 = '\x01' << ((byte)iVar19 & 0x1f);
          auVar221 = ZEXT464(*(uint *)(local_2a0 + (uint)(iVar19 << 2)));
          fVar168 = local_884;
          fVar149 = *(float *)(local_200 + (uint)(iVar19 << 2));
          uVar150 = 0;
          uVar232 = 0;
          uVar233 = 0;
          if ((float)local_6c0._0_4_ < 0.0) {
            local_700._0_16_ = ZEXT416((uint)*(float *)(local_200 + (uint)(iVar19 << 2)));
            local_820._0_16_ = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar19 << 2)));
            auVar247 = ZEXT1664(auVar247._0_16_);
            fVar168 = sqrtf((float)local_6c0._0_4_);
            auVar221 = ZEXT1664(local_820._0_16_);
            auVar248 = ZEXT3264(local_880);
            auVar251 = ZEXT3264(local_840);
            auVar228 = ZEXT3264(local_7c0);
            auVar241 = ZEXT3264(local_7a0);
            auVar235 = ZEXT3264(local_780);
            auVar231 = ZEXT3264(local_760);
            auVar250 = ZEXT3264(local_740);
            auVar249 = ZEXT3264(local_720);
            fVar149 = (float)local_700._0_4_;
            uVar150 = local_700._4_4_;
            uVar232 = local_700._8_4_;
            uVar233 = local_700._12_4_;
          }
          uVar60 = (ulong)bVar51;
          auVar78 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar74 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar75 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar79 = vminps_avx(auVar78,auVar75);
          auVar78 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar75 = vmaxps_avx(auVar74,auVar78);
          auVar199._8_4_ = 0x7fffffff;
          auVar199._0_8_ = 0x7fffffff7fffffff;
          auVar199._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar79,auVar199);
          auVar78 = vandps_avx(auVar75,auVar199);
          auVar74 = vmaxps_avx(auVar74,auVar78);
          auVar78 = vmovshdup_avx(auVar74);
          auVar78 = vmaxss_avx(auVar78,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar78);
          fVar169 = auVar74._0_4_ * 1.9073486e-06;
          local_600 = vshufps_avx(auVar75,auVar75,0xff);
          uVar52 = 0;
          while( true ) {
            auVar90 = local_700;
            bVar48 = (byte)uVar60;
            if (uVar52 == 5) break;
            uVar242 = auVar221._0_4_;
            auVar140._4_4_ = uVar242;
            auVar140._0_4_ = uVar242;
            auVar140._8_4_ = uVar242;
            auVar140._12_4_ = uVar242;
            auVar78 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_6b0);
            fVar170 = 1.0 - fVar149;
            auVar184._0_4_ = local_5a0._0_4_ * fVar149;
            auVar184._4_4_ = local_5a0._4_4_ * fVar149;
            auVar184._8_4_ = local_5a0._8_4_ * fVar149;
            auVar184._12_4_ = local_5a0._12_4_ * fVar149;
            local_500._0_16_ = ZEXT416((uint)fVar170);
            auVar200._4_4_ = fVar170;
            auVar200._0_4_ = fVar170;
            auVar200._8_4_ = fVar170;
            auVar200._12_4_ = fVar170;
            auVar74 = vfmadd231ps_fma(auVar184,auVar200,local_560._0_16_);
            auVar209._0_4_ = local_580._0_4_ * fVar149;
            auVar209._4_4_ = local_580._4_4_ * fVar149;
            auVar209._8_4_ = local_580._8_4_ * fVar149;
            auVar209._12_4_ = local_580._12_4_ * fVar149;
            auVar75 = vfmadd231ps_fma(auVar209,auVar200,local_5a0._0_16_);
            auVar218._0_4_ = fVar149 * (float)local_5c0._0_4_;
            auVar218._4_4_ = fVar149 * (float)local_5c0._4_4_;
            auVar218._8_4_ = fVar149 * fStack_5b8;
            auVar218._12_4_ = fVar149 * fStack_5b4;
            auVar79 = vfmadd231ps_fma(auVar218,auVar200,local_580._0_16_);
            auVar226._0_4_ = fVar149 * auVar75._0_4_;
            auVar226._4_4_ = fVar149 * auVar75._4_4_;
            auVar226._8_4_ = fVar149 * auVar75._8_4_;
            auVar226._12_4_ = fVar149 * auVar75._12_4_;
            auVar74 = vfmadd231ps_fma(auVar226,auVar200,auVar74);
            auVar185._0_4_ = fVar149 * auVar79._0_4_;
            auVar185._4_4_ = fVar149 * auVar79._4_4_;
            auVar185._8_4_ = fVar149 * auVar79._8_4_;
            auVar185._12_4_ = fVar149 * auVar79._12_4_;
            auVar75 = vfmadd231ps_fma(auVar185,auVar200,auVar75);
            auVar210._0_4_ = fVar149 * auVar75._0_4_;
            auVar210._4_4_ = fVar149 * auVar75._4_4_;
            auVar210._8_4_ = fVar149 * auVar75._8_4_;
            auVar210._12_4_ = fVar149 * auVar75._12_4_;
            auVar79 = vfmadd231ps_fma(auVar210,auVar74,auVar200);
            auVar74 = vsubps_avx(auVar75,auVar74);
            auVar25._8_4_ = 0x40400000;
            auVar25._0_8_ = 0x4040000040400000;
            auVar25._12_4_ = 0x40400000;
            auVar75 = vmulps_avx512vl(auVar74,auVar25);
            _local_4e0 = auVar79;
            auVar78 = vsubps_avx(auVar78,auVar79);
            auVar74 = vdpps_avx(auVar78,auVar78,0x7f);
            local_860._0_16_ = auVar75;
            local_6e0._0_16_ = auVar74;
            local_700._4_4_ = uVar150;
            local_700._0_4_ = fVar149;
            local_700._8_4_ = uVar232;
            local_700._16_16_ = auVar90._16_16_;
            local_700._12_4_ = uVar233;
            local_820._0_16_ = auVar221._0_16_;
            if (auVar74._0_4_ < 0.0) {
              auVar241._0_4_ = sqrtf(auVar74._0_4_);
              auVar241._4_60_ = extraout_var_01;
              auVar74 = auVar241._0_16_;
              uVar60 = extraout_RAX_02;
              auVar75 = local_860._0_16_;
            }
            else {
              auVar74 = vsqrtss_avx(auVar74,auVar74);
            }
            local_520._0_16_ = vdpps_avx(auVar75,auVar75,0x7f);
            fVar170 = local_520._0_4_;
            auVar186._4_12_ = ZEXT812(0) << 0x20;
            auVar186._0_4_ = fVar170;
            local_660._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar186);
            fVar149 = local_660._0_4_ * 1.5;
            local_540._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar186);
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar81 = vxorps_avx512vl(local_520._0_16_,auVar26);
            auVar79 = vfnmadd213ss_fma(local_540._0_16_,local_520._0_16_,ZEXT416(0x40000000));
            local_680._0_4_ = auVar79._0_4_;
            local_640._0_4_ = auVar74._0_4_;
            if (fVar170 < auVar81._0_4_) {
              local_6a0._0_4_ = fVar149;
              fVar172 = sqrtf(fVar170);
              auVar74 = ZEXT416((uint)local_640._0_4_);
              uVar60 = extraout_RAX_03;
              auVar75 = local_860._0_16_;
            }
            else {
              auVar79 = vsqrtss_avx(local_520._0_16_,local_520._0_16_);
              fVar172 = auVar79._0_4_;
              local_6a0._0_4_ = fVar149;
            }
            fVar149 = local_660._0_4_;
            fVar149 = (float)local_6a0._0_4_ + fVar170 * -0.5 * fVar149 * fVar149 * fVar149;
            local_6a0._0_4_ = auVar75._0_4_ * fVar149;
            local_6a0._4_4_ = auVar75._4_4_ * fVar149;
            local_6a0._8_4_ = auVar75._8_4_ * fVar149;
            local_6a0._12_4_ = auVar75._12_4_ * fVar149;
            local_660._0_16_ = vdpps_avx(local_6a0._0_16_,auVar78,0x7f);
            auVar80 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
            auVar141._0_4_ = local_660._0_4_ * local_660._0_4_;
            auVar141._4_4_ = local_660._4_4_ * local_660._4_4_;
            auVar141._8_4_ = local_660._8_4_ * local_660._8_4_;
            auVar141._12_4_ = local_660._12_4_ * local_660._12_4_;
            auVar79 = vsubps_avx(local_6e0._0_16_,auVar141);
            fVar170 = auVar79._0_4_;
            auVar160._4_12_ = ZEXT812(0) << 0x20;
            auVar160._0_4_ = fVar170;
            auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar160);
            auVar82 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
            auVar71 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
            uVar59 = fVar170 == 0.0;
            uVar58 = fVar170 < 0.0;
            if ((bool)uVar58) {
              local_5f0 = fVar149;
              fStack_5ec = fVar149;
              fStack_5e8 = fVar149;
              fStack_5e4 = fVar149;
              local_5e0 = auVar81;
              fVar170 = sqrtf(fVar170);
              auVar71 = ZEXT416(auVar71._0_4_);
              auVar82 = ZEXT416(auVar82._0_4_);
              auVar74 = ZEXT416((uint)local_640._0_4_);
              auVar80 = ZEXT416(auVar80._0_4_);
              uVar60 = extraout_RAX_04;
              auVar75 = local_860._0_16_;
              auVar81 = local_5e0;
              fVar149 = local_5f0;
              fVar171 = fStack_5ec;
              fVar173 = fStack_5e8;
              fVar174 = fStack_5e4;
            }
            else {
              auVar79 = vsqrtss_avx(auVar79,auVar79);
              fVar170 = auVar79._0_4_;
              fVar171 = fVar149;
              fVar173 = fVar149;
              fVar174 = fVar149;
            }
            auVar247 = ZEXT1664(auVar75);
            auVar249 = ZEXT3264(local_720);
            auVar250 = ZEXT3264(local_740);
            auVar231 = ZEXT3264(local_760);
            auVar235 = ZEXT3264(local_780);
            auVar241 = ZEXT3264(local_7a0);
            auVar251 = ZEXT3264(local_840);
            auVar248 = ZEXT3264(local_880);
            auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_700._0_16_,
                                      local_500._0_16_);
            fVar151 = auVar79._0_4_ * 6.0;
            fVar14 = local_700._0_4_ * 6.0;
            auVar187._0_4_ = fVar14 * (float)local_5c0._0_4_;
            auVar187._4_4_ = fVar14 * (float)local_5c0._4_4_;
            auVar187._8_4_ = fVar14 * fStack_5b8;
            auVar187._12_4_ = fVar14 * fStack_5b4;
            auVar161._4_4_ = fVar151;
            auVar161._0_4_ = fVar151;
            auVar161._8_4_ = fVar151;
            auVar161._12_4_ = fVar151;
            auVar79 = vfmadd132ps_fma(auVar161,auVar187,local_580._0_16_);
            auVar66 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_500._0_16_,
                                      local_700._0_16_);
            fVar151 = auVar66._0_4_ * 6.0;
            auVar188._4_4_ = fVar151;
            auVar188._0_4_ = fVar151;
            auVar188._8_4_ = fVar151;
            auVar188._12_4_ = fVar151;
            auVar79 = vfmadd132ps_fma(auVar188,auVar79,local_5a0._0_16_);
            fVar151 = local_500._0_4_ * 6.0;
            auVar162._4_4_ = fVar151;
            auVar162._0_4_ = fVar151;
            auVar162._8_4_ = fVar151;
            auVar162._12_4_ = fVar151;
            auVar79 = vfmadd132ps_fma(auVar162,auVar79,local_560._0_16_);
            auVar189._0_4_ = auVar79._0_4_ * (float)local_520._0_4_;
            auVar189._4_4_ = auVar79._4_4_ * (float)local_520._0_4_;
            auVar189._8_4_ = auVar79._8_4_ * (float)local_520._0_4_;
            auVar189._12_4_ = auVar79._12_4_ * (float)local_520._0_4_;
            auVar79 = vdpps_avx(auVar75,auVar79,0x7f);
            fVar151 = auVar79._0_4_;
            auVar163._0_4_ = auVar75._0_4_ * fVar151;
            auVar163._4_4_ = auVar75._4_4_ * fVar151;
            auVar163._8_4_ = auVar75._8_4_ * fVar151;
            auVar163._12_4_ = auVar75._12_4_ * fVar151;
            auVar79 = vsubps_avx(auVar189,auVar163);
            fVar151 = (float)local_680._0_4_ * (float)local_540._0_4_;
            auVar27._8_4_ = 0x80000000;
            auVar27._0_8_ = 0x8000000080000000;
            auVar27._12_4_ = 0x80000000;
            auVar68 = vxorps_avx512vl(auVar75,auVar27);
            auVar211._0_4_ = fVar149 * auVar79._0_4_ * fVar151;
            auVar211._4_4_ = fVar171 * auVar79._4_4_ * fVar151;
            auVar211._8_4_ = fVar173 * auVar79._8_4_ * fVar151;
            auVar211._12_4_ = fVar174 * auVar79._12_4_ * fVar151;
            auVar79 = vdpps_avx(auVar68,local_6a0._0_16_,0x7f);
            auVar67 = vmaxss_avx(ZEXT416((uint)fVar169),
                                 ZEXT416((uint)((float)local_820._0_4_ * fVar168 * 1.9073486e-06)));
            auVar66 = vdpps_avx(auVar78,auVar211,0x7f);
            auVar74 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar169),auVar67);
            vfmadd213ss_avx512f(auVar80,ZEXT416((uint)(fVar169 / fVar172)),auVar74);
            auVar74 = vdpps_avx(local_6b0,local_6a0._0_16_,0x7f);
            fVar172 = auVar79._0_4_ + auVar66._0_4_;
            auVar79 = vdpps_avx(auVar78,auVar68,0x7f);
            auVar80 = vmulss_avx512f(auVar71,auVar81);
            auVar71 = vmulss_avx512f(auVar81,auVar81);
            auVar81 = vdpps_avx(auVar78,local_6b0,0x7f);
            auVar71 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar80._0_4_ * auVar71._0_4_)));
            auVar80 = vfnmadd231ss_fma(auVar79,local_660._0_16_,ZEXT416((uint)fVar172));
            auVar82 = vfnmadd231ss_fma(auVar81,local_660._0_16_,auVar74);
            auVar79 = vpermilps_avx(_local_4e0,0xff);
            fVar170 = fVar170 - auVar79._0_4_;
            auVar79 = vshufps_avx(auVar75,auVar75,0xff);
            auVar81 = vfmsub213ss_fma(auVar80,auVar71,auVar79);
            fVar149 = auVar82._0_4_ * auVar71._0_4_;
            auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar81._0_4_)),
                                      ZEXT416((uint)fVar172),ZEXT416((uint)fVar149));
            fVar171 = auVar80._0_4_;
            fVar149 = local_700._0_4_ -
                      (local_660._0_4_ * (fVar149 / fVar171) - fVar170 * (auVar74._0_4_ / fVar171));
            uVar150 = 0;
            uVar232 = 0;
            uVar233 = 0;
            fVar172 = (float)local_820._0_4_ -
                      (fVar170 * (fVar172 / fVar171) - local_660._0_4_ * (auVar81._0_4_ / fVar171));
            auVar221 = ZEXT464((uint)fVar172);
            auVar28._8_4_ = 0x7fffffff;
            auVar28._0_8_ = 0x7fffffff7fffffff;
            auVar28._12_4_ = 0x7fffffff;
            auVar74 = vandps_avx512vl(local_660._0_16_,auVar28);
            auVar74 = vucomiss_avx512f(auVar74);
            if (!(bool)uVar58 && !(bool)uVar59) {
              auVar74 = vaddss_avx512f(auVar67,auVar74);
              auVar74 = vfmadd231ss_fma(auVar74,local_600,ZEXT416(0x36000000));
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar81 = vandps_avx512vl(ZEXT416((uint)fVar170),auVar29);
              if (auVar81._0_4_ < auVar74._0_4_) {
                bVar57 = uVar52 < 5;
                fVar172 = fVar172 + (float)local_610._0_4_;
                auVar228 = ZEXT3264(local_7c0);
                if (fVar172 < fVar13) {
LAB_0189bfbe:
                  bVar48 = 0;
                  goto LAB_0189bfc6;
                }
                fVar168 = *(float *)(ray + k * 4 + 0x80);
                if (fVar172 <= fVar168) {
                  bVar48 = 0;
                  if ((fVar149 < 0.0) || (1.0 < fVar149)) goto LAB_0189bfc6;
                  auVar190._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar190._0_4_ = local_6e0._0_4_;
                  auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar190);
                  fVar169 = auVar74._0_4_;
                  pGVar54 = (context->scene->geometries).items[local_7f8].ptr;
                  if ((pGVar54->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0189bfbe;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar48 = 1, pGVar54->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_0189bfc6;
                  fVar169 = fVar169 * 1.5 +
                            (float)local_6e0._0_4_ * -0.5 * fVar169 * fVar169 * fVar169;
                  local_9c0 = auVar78._0_4_;
                  fStack_9bc = auVar78._4_4_;
                  fStack_9b8 = auVar78._8_4_;
                  fStack_9b4 = auVar78._12_4_;
                  auVar191._0_4_ = fVar169 * local_9c0;
                  auVar191._4_4_ = fVar169 * fStack_9bc;
                  auVar191._8_4_ = fVar169 * fStack_9b8;
                  auVar191._12_4_ = fVar169 * fStack_9b4;
                  auVar81 = vfmadd213ps_fma(auVar79,auVar191,auVar75);
                  auVar74 = vshufps_avx(auVar191,auVar191,0xc9);
                  auVar78 = vshufps_avx(auVar75,auVar75,0xc9);
                  auVar192._0_4_ = auVar191._0_4_ * auVar78._0_4_;
                  auVar192._4_4_ = auVar191._4_4_ * auVar78._4_4_;
                  auVar192._8_4_ = auVar191._8_4_ * auVar78._8_4_;
                  auVar192._12_4_ = auVar191._12_4_ * auVar78._12_4_;
                  auVar79 = vfmsub231ps_fma(auVar192,auVar75,auVar74);
                  auVar74 = vshufps_avx(auVar79,auVar79,0xc9);
                  auVar78 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                  auVar142._0_4_ = auVar81._0_4_ * auVar79._0_4_;
                  auVar142._4_4_ = auVar81._4_4_ * auVar79._4_4_;
                  auVar142._8_4_ = auVar81._8_4_ * auVar79._8_4_;
                  auVar142._12_4_ = auVar81._12_4_ * auVar79._12_4_;
                  auVar74 = vfmsub231ps_fma(auVar142,auVar74,auVar78);
                  local_480 = (RTCHitN  [16])vshufps_avx(auVar74,auVar74,0x55);
                  auStack_470 = vshufps_avx(auVar74,auVar74,0xaa);
                  local_460 = auVar74._0_4_;
                  uStack_45c = local_460;
                  uStack_458 = local_460;
                  uStack_454 = local_460;
                  local_450 = fVar149;
                  fStack_44c = fVar149;
                  fStack_448 = fVar149;
                  fStack_444 = fVar149;
                  local_440 = ZEXT416(0) << 0x20;
                  local_430 = local_490._0_8_;
                  uStack_428 = local_490._8_8_;
                  local_420 = local_4a0;
                  vpcmpeqd_avx2(ZEXT1632(local_4a0),ZEXT1632(local_4a0));
                  uStack_40c = context->user->instID[0];
                  local_410 = uStack_40c;
                  uStack_408 = uStack_40c;
                  uStack_404 = uStack_40c;
                  uStack_400 = context->user->instPrimID[0];
                  uStack_3fc = uStack_400;
                  uStack_3f8 = uStack_400;
                  uStack_3f4 = uStack_400;
                  *(float *)(ray + k * 4 + 0x80) = fVar172;
                  local_8a0 = local_4b0;
                  local_7f0.valid = (int *)local_8a0;
                  local_7f0.geometryUserPtr = pGVar54->userPtr;
                  local_7f0.context = context->user;
                  local_7f0.hit = local_480;
                  local_7f0.N = 4;
                  local_860._0_4_ = fVar168;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar54->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar247 = ZEXT1664(auVar75);
                    (*pGVar54->occlusionFilterN)(&local_7f0);
                    auVar248 = ZEXT3264(local_880);
                    auVar251 = ZEXT3264(local_840);
                    auVar228 = ZEXT3264(local_7c0);
                    auVar241 = ZEXT3264(local_7a0);
                    auVar235 = ZEXT3264(local_780);
                    auVar231 = ZEXT3264(local_760);
                    auVar250 = ZEXT3264(local_740);
                    auVar249 = ZEXT3264(local_720);
                    fVar168 = (float)local_860._0_4_;
                  }
                  uVar60 = vptestmd_avx512vl(local_8a0,local_8a0);
                  if ((uVar60 & 0xf) != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar54->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      (*p_Var5)(&local_7f0);
                      auVar248 = ZEXT3264(local_880);
                      auVar251 = ZEXT3264(local_840);
                      auVar228 = ZEXT3264(local_7c0);
                      auVar241 = ZEXT3264(local_7a0);
                      auVar235 = ZEXT3264(local_780);
                      auVar231 = ZEXT3264(local_760);
                      auVar250 = ZEXT3264(local_740);
                      auVar249 = ZEXT3264(local_720);
                      fVar168 = (float)local_860._0_4_;
                    }
                    uVar60 = vptestmd_avx512vl(local_8a0,local_8a0);
                    uVar60 = uVar60 & 0xf;
                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar6 = (bool)((byte)uVar60 & 1);
                    bVar7 = (bool)((byte)(uVar60 >> 1) & 1);
                    bVar8 = (bool)((byte)(uVar60 >> 2) & 1);
                    bVar9 = SUB81(uVar60 >> 3,0);
                    *(uint *)(local_7f0.ray + 0x80) =
                         (uint)bVar6 * auVar74._0_4_ | (uint)!bVar6 * *(int *)(local_7f0.ray + 0x80)
                    ;
                    *(uint *)(local_7f0.ray + 0x84) =
                         (uint)bVar7 * auVar74._4_4_ | (uint)!bVar7 * *(int *)(local_7f0.ray + 0x84)
                    ;
                    *(uint *)(local_7f0.ray + 0x88) =
                         (uint)bVar8 * auVar74._8_4_ | (uint)!bVar8 * *(int *)(local_7f0.ray + 0x88)
                    ;
                    *(uint *)(local_7f0.ray + 0x8c) =
                         (uint)bVar9 * auVar74._12_4_ |
                         (uint)!bVar9 * *(int *)(local_7f0.ray + 0x8c);
                    bVar48 = 1;
                    if ((byte)uVar60 != 0) goto LAB_0189bfc6;
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar168;
                }
                bVar48 = 0;
                goto LAB_0189bfc6;
              }
            }
            uVar52 = uVar52 + 1;
            auVar228 = ZEXT3264(local_7c0);
          }
          bVar57 = false;
LAB_0189bfc6:
          bVar49 = bVar49 | bVar57 & bVar48;
          uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar220._4_4_ = uVar150;
          auVar220._0_4_ = uVar150;
          auVar220._8_4_ = uVar150;
          auVar220._12_4_ = uVar150;
          auVar220._16_4_ = uVar150;
          auVar220._20_4_ = uVar150;
          auVar220._24_4_ = uVar150;
          auVar220._28_4_ = uVar150;
          auVar221 = ZEXT3264(auVar220);
          auVar45._4_4_ = fStack_31c;
          auVar45._0_4_ = local_320;
          auVar45._8_4_ = fStack_318;
          auVar45._12_4_ = fStack_314;
          auVar45._16_4_ = fStack_310;
          auVar45._20_4_ = fStack_30c;
          auVar45._24_4_ = fStack_308;
          auVar45._28_4_ = fStack_304;
          uVar16 = vcmpps_avx512vl(auVar220,auVar45,0xd);
        }
        uVar18 = vpcmpd_avx512vl(local_2e0,local_280,1);
        uVar17 = vpcmpd_avx512vl(local_2e0,_local_340,1);
        auVar167._0_4_ = (float)local_360._0_4_ + (float)local_1c0._0_4_;
        auVar167._4_4_ = (float)local_360._4_4_ + (float)local_1c0._4_4_;
        auVar167._8_4_ = fStack_358 + fStack_1b8;
        auVar167._12_4_ = fStack_354 + fStack_1b4;
        auVar167._16_4_ = fStack_350 + fStack_1b0;
        auVar167._20_4_ = fStack_34c + fStack_1ac;
        auVar167._24_4_ = fStack_348 + fStack_1a8;
        auVar167._28_4_ = fStack_344 + fStack_1a4;
        uVar150 = auVar221._0_4_;
        auVar195._4_4_ = uVar150;
        auVar195._0_4_ = uVar150;
        auVar195._8_4_ = uVar150;
        auVar195._12_4_ = uVar150;
        auVar195._16_4_ = uVar150;
        auVar195._20_4_ = uVar150;
        auVar195._24_4_ = uVar150;
        auVar195._28_4_ = uVar150;
        uVar16 = vcmpps_avx512vl(auVar167,auVar195,2);
        bVar53 = (byte)local_88c & (byte)uVar18 & (byte)uVar16;
        auVar202._0_4_ = (float)local_360._0_4_ + (float)local_2c0._0_4_;
        auVar202._4_4_ = (float)local_360._4_4_ + (float)local_2c0._4_4_;
        auVar202._8_4_ = fStack_358 + fStack_2b8;
        auVar202._12_4_ = fStack_354 + fStack_2b4;
        auVar202._16_4_ = fStack_350 + fStack_2b0;
        auVar202._20_4_ = fStack_34c + fStack_2ac;
        auVar202._24_4_ = fStack_348 + fStack_2a8;
        auVar202._28_4_ = fStack_344 + fStack_2a4;
        uVar16 = vcmpps_avx512vl(auVar202,auVar195,2);
        bVar47 = bVar47 & (byte)uVar17 & (byte)uVar16 | bVar53;
        if (bVar47 != 0) {
          uVar52 = (ulong)uVar56;
          abStack_180[uVar52 * 0x60] = bVar47;
          bVar57 = (bool)(bVar53 >> 1 & 1);
          bVar6 = (bool)(bVar53 >> 2 & 1);
          bVar7 = (bool)(bVar53 >> 3 & 1);
          bVar8 = (bool)(bVar53 >> 4 & 1);
          bVar9 = (bool)(bVar53 >> 5 & 1);
          bVar10 = (bool)(bVar53 >> 6 & 1);
          auStack_160[uVar52 * 0x18] =
               (uint)(bVar53 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar53 & 1) * local_2c0._0_4_;
          auStack_160[uVar52 * 0x18 + 1] =
               (uint)bVar57 * local_1c0._4_4_ | (uint)!bVar57 * local_2c0._4_4_;
          auStack_160[uVar52 * 0x18 + 2] =
               (uint)bVar6 * (int)fStack_1b8 | (uint)!bVar6 * (int)fStack_2b8;
          auStack_160[uVar52 * 0x18 + 3] =
               (uint)bVar7 * (int)fStack_1b4 | (uint)!bVar7 * (int)fStack_2b4;
          auStack_160[uVar52 * 0x18 + 4] =
               (uint)bVar8 * (int)fStack_1b0 | (uint)!bVar8 * (int)fStack_2b0;
          auStack_160[uVar52 * 0x18 + 5] =
               (uint)bVar9 * (int)fStack_1ac | (uint)!bVar9 * (int)fStack_2ac;
          auStack_160[uVar52 * 0x18 + 6] =
               (uint)bVar10 * (int)fStack_1a8 | (uint)!bVar10 * (int)fStack_2a8;
          auStack_160[uVar52 * 0x18 + 7] =
               (uint)(bVar53 >> 7) * (int)fStack_1a4 | (uint)!(bool)(bVar53 >> 7) * (int)fStack_2a4;
          uVar60 = vmovlps_avx(local_2f0);
          (&uStack_140)[uVar52 * 0xc] = uVar60;
          aiStack_138[uVar52 * 0x18] = local_a14 + 1;
          uVar56 = uVar56 + 1;
        }
        auVar221 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
      }
    }
    do {
      uVar61 = uVar56;
      uVar128 = uVar61 - 1;
      if (uVar61 == 0) {
        if (bVar49 != 0) goto LAB_0189c564;
        uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar30._4_4_ = uVar150;
        auVar30._0_4_ = uVar150;
        auVar30._8_4_ = uVar150;
        auVar30._12_4_ = uVar150;
        uVar16 = vcmpps_avx512vl(local_300,auVar30,2);
        local_5c8 = (ulong)((uint)uVar16 & (uint)local_5c8 - 1 & (uint)local_5c8);
        goto LAB_01899ca8;
      }
      uVar60 = (ulong)uVar128;
      auVar90 = *(undefined1 (*) [32])(auStack_160 + uVar60 * 0x18);
      auVar164._0_4_ = auVar90._0_4_ + (float)local_360._0_4_;
      auVar164._4_4_ = auVar90._4_4_ + (float)local_360._4_4_;
      auVar164._8_4_ = auVar90._8_4_ + fStack_358;
      auVar164._12_4_ = auVar90._12_4_ + fStack_354;
      auVar164._16_4_ = auVar90._16_4_ + fStack_350;
      auVar164._20_4_ = auVar90._20_4_ + fStack_34c;
      auVar164._24_4_ = auVar90._24_4_ + fStack_348;
      auVar164._28_4_ = auVar90._28_4_ + fStack_344;
      uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar33._4_4_ = uVar150;
      auVar33._0_4_ = uVar150;
      auVar33._8_4_ = uVar150;
      auVar33._12_4_ = uVar150;
      auVar33._16_4_ = uVar150;
      auVar33._20_4_ = uVar150;
      auVar33._24_4_ = uVar150;
      auVar33._28_4_ = uVar150;
      uVar16 = vcmpps_avx512vl(auVar164,auVar33,2);
      uVar129 = (uint)uVar16 & (uint)abStack_180[uVar60 * 0x60];
      uVar56 = uVar128;
    } while (uVar129 == 0);
    uVar52 = (&uStack_140)[uVar60 * 0xc];
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar52;
    auVar194._8_4_ = 0x7f800000;
    auVar194._0_8_ = 0x7f8000007f800000;
    auVar194._12_4_ = 0x7f800000;
    auVar194._16_4_ = 0x7f800000;
    auVar194._20_4_ = 0x7f800000;
    auVar194._24_4_ = 0x7f800000;
    auVar194._28_4_ = 0x7f800000;
    auVar92 = vblendmps_avx512vl(auVar194,auVar90);
    bVar47 = (byte)uVar129;
    auVar123._0_4_ =
         (uint)(bVar47 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar47 & 1) * (int)auVar90._0_4_;
    bVar57 = (bool)((byte)(uVar129 >> 1) & 1);
    auVar123._4_4_ = (uint)bVar57 * auVar92._4_4_ | (uint)!bVar57 * (int)auVar90._4_4_;
    bVar57 = (bool)((byte)(uVar129 >> 2) & 1);
    auVar123._8_4_ = (uint)bVar57 * auVar92._8_4_ | (uint)!bVar57 * (int)auVar90._8_4_;
    bVar57 = (bool)((byte)(uVar129 >> 3) & 1);
    auVar123._12_4_ = (uint)bVar57 * auVar92._12_4_ | (uint)!bVar57 * (int)auVar90._12_4_;
    bVar57 = (bool)((byte)(uVar129 >> 4) & 1);
    auVar123._16_4_ = (uint)bVar57 * auVar92._16_4_ | (uint)!bVar57 * (int)auVar90._16_4_;
    bVar57 = (bool)((byte)(uVar129 >> 5) & 1);
    auVar123._20_4_ = (uint)bVar57 * auVar92._20_4_ | (uint)!bVar57 * (int)auVar90._20_4_;
    bVar57 = (bool)((byte)(uVar129 >> 6) & 1);
    auVar123._24_4_ = (uint)bVar57 * auVar92._24_4_ | (uint)!bVar57 * (int)auVar90._24_4_;
    auVar123._28_4_ =
         (uVar129 >> 7) * auVar92._28_4_ | (uint)!SUB41(uVar129 >> 7,0) * (int)auVar90._28_4_;
    auVar90 = vshufps_avx(auVar123,auVar123,0xb1);
    auVar90 = vminps_avx(auVar123,auVar90);
    auVar92 = vshufpd_avx(auVar90,auVar90,5);
    auVar90 = vminps_avx(auVar90,auVar92);
    auVar92 = vpermpd_avx2(auVar90,0x4e);
    auVar90 = vminps_avx(auVar90,auVar92);
    uVar16 = vcmpps_avx512vl(auVar123,auVar90,0);
    bVar53 = (byte)uVar16 & bVar47;
    if (bVar53 != 0) {
      uVar129 = (uint)bVar53;
    }
    uVar130 = 0;
    for (; (uVar129 & 1) == 0; uVar129 = uVar129 >> 1 | 0x80000000) {
      uVar130 = uVar130 + 1;
    }
    local_a14 = aiStack_138[uVar60 * 0x18];
    bVar47 = ~('\x01' << ((byte)uVar130 & 0x1f)) & bVar47;
    abStack_180[uVar60 * 0x60] = bVar47;
    uVar56 = uVar61;
    if (bVar47 == 0) {
      uVar56 = uVar128;
    }
    uVar150 = (undefined4)uVar52;
    auVar143._4_4_ = uVar150;
    auVar143._0_4_ = uVar150;
    auVar143._8_4_ = uVar150;
    auVar143._12_4_ = uVar150;
    auVar143._16_4_ = uVar150;
    auVar143._20_4_ = uVar150;
    auVar143._24_4_ = uVar150;
    auVar143._28_4_ = uVar150;
    auVar74 = vmovshdup_avx(auVar155);
    auVar74 = vsubps_avx(auVar74,auVar155);
    auVar165._0_4_ = auVar74._0_4_;
    auVar165._4_4_ = auVar165._0_4_;
    auVar165._8_4_ = auVar165._0_4_;
    auVar165._12_4_ = auVar165._0_4_;
    auVar165._16_4_ = auVar165._0_4_;
    auVar165._20_4_ = auVar165._0_4_;
    auVar165._24_4_ = auVar165._0_4_;
    auVar165._28_4_ = auVar165._0_4_;
    auVar74 = vfmadd132ps_fma(auVar165,auVar143,_DAT_01f7b040);
    _local_480 = ZEXT1632(auVar74);
    local_2f0._8_8_ = 0;
    local_2f0._0_8_ = *(ulong *)(local_480 + (ulong)uVar130 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }